

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O1

TestCaseGroup * deqp::egl::createRobustnessTests(EglTestContext *eglTestCtx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 *puVar2;
  char *pcVar3;
  pointer pcVar4;
  long lVar5;
  char *pcVar6;
  undefined1 *puVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  int iVar10;
  TestCaseGroup *this;
  TestCaseGroup *pTVar11;
  TestCaseGroup *pTVar12;
  TestNode *pTVar13;
  RobustnessTestCase *pRVar14;
  TestCaseGroup *pTVar15;
  TestCaseGroup *pTVar16;
  TestCaseGroup *pTVar17;
  TestCaseGroup *this_00;
  TestCase *pTVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long *plVar19;
  long lVar20;
  undefined1 local_1020 [32];
  _Alloc_hider local_1000;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ff0 [2];
  size_type local_fd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc8;
  TestCaseGroup *local_fa8;
  TestCaseGroup *local_fa0;
  string local_f98;
  TestCaseGroup *local_f78;
  TestCaseGroup *local_f70;
  TestCaseGroup *local_f68;
  string local_f60;
  string local_f40;
  string local_f20;
  string local_f00;
  string local_ee0;
  TestCaseGroup *local_ec0;
  TestCaseGroup *local_eb8;
  TestCaseGroup *local_eb0;
  TestCaseGroup *local_ea8;
  TestCaseGroup *local_ea0;
  string resetScenarioDescription;
  string local_e70;
  string local_e50;
  string local_e30;
  string local_e10;
  string local_df0;
  string local_dd0;
  string local_db0;
  string local_d90;
  string local_d70;
  string local_d50;
  string local_d30;
  string local_d10;
  string local_cf0;
  string local_cd0;
  string local_cb0;
  string local_c90;
  string local_c70;
  string local_c50;
  string local_c30;
  string local_c10;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  TestCaseGroup *local_a10;
  TestCaseGroup *local_a08;
  TestCaseGroup *local_a00;
  TestCaseGroup *local_9f8;
  TestCaseGroup *local_9f0;
  TestCaseGroup *local_9e8;
  ReadWriteType local_9e0;
  ResourceType local_9dc;
  ShaderType local_9d8;
  ContextResetType local_9d4;
  RobustAccessType local_9d0;
  ReadWriteType local_9cc;
  ResourceType local_9c8;
  ShaderType local_9c4;
  ContextResetType local_9c0;
  RobustAccessType local_9bc;
  ReadWriteType local_9b8;
  ResourceType local_9b4;
  ShaderType local_9b0;
  ContextResetType local_9ac;
  RobustAccessType local_9a8;
  ReadWriteType local_9a4;
  ResourceType local_9a0;
  ShaderType local_99c;
  ContextResetType local_998;
  RobustAccessType local_994;
  ReadWriteType local_990;
  ResourceType local_98c;
  ShaderType local_988;
  ContextResetType local_984;
  RobustAccessType local_980;
  ReadWriteType local_97c;
  ResourceType local_978;
  ShaderType local_974;
  ContextResetType local_970;
  RobustAccessType local_96c;
  ReadWriteType local_968;
  ResourceType local_964;
  ShaderType local_960;
  ContextResetType local_95c;
  RobustAccessType local_958;
  ReadWriteType local_954;
  ResourceType local_950;
  ShaderType local_94c;
  ContextResetType local_948;
  RobustAccessType local_944;
  ReadWriteType local_940;
  ResourceType local_93c;
  ShaderType local_938;
  ContextResetType local_934;
  RobustAccessType local_930;
  ReadWriteType local_92c;
  ResourceType local_928;
  ShaderType local_924;
  ContextResetType local_920;
  RobustAccessType local_91c;
  ReadWriteType local_918;
  ResourceType local_914;
  ShaderType local_910;
  ContextResetType local_90c;
  RobustAccessType local_908;
  ReadWriteType local_904;
  ResourceType local_900;
  ShaderType local_8fc;
  ContextResetType local_8f8;
  RobustAccessType local_8f4;
  ReadWriteType local_8f0;
  ResourceType local_8ec;
  ShaderType local_8e8;
  ContextResetType local_8e4;
  RobustAccessType local_8e0;
  ReadWriteType local_8dc;
  ResourceType local_8d8;
  ShaderType local_8d4;
  ContextResetType local_8d0;
  RobustAccessType local_8cc;
  ReadWriteType local_8c8;
  ResourceType local_8c4;
  ShaderType local_8c0;
  ContextResetType local_8bc;
  RobustAccessType local_8b8;
  ReadWriteType local_8b4;
  ResourceType local_8b0;
  ShaderType local_8ac;
  ContextResetType local_8a8;
  RobustAccessType local_8a4;
  ReadWriteType local_8a0;
  ResourceType local_89c;
  ShaderType local_898;
  ContextResetType local_894;
  RobustAccessType local_890;
  ReadWriteType local_88c;
  ResourceType local_888;
  ShaderType local_884;
  ContextResetType local_880;
  RobustAccessType local_87c;
  ReadWriteType local_878;
  ResourceType local_874;
  ShaderType local_870;
  ContextResetType local_86c;
  RobustAccessType local_868;
  ReadWriteType local_864;
  ResourceType local_860;
  ShaderType local_85c;
  ContextResetType local_858;
  RobustAccessType local_854;
  ReadWriteType local_850;
  ResourceType local_84c;
  ShaderType local_848;
  ContextResetType local_844;
  RobustAccessType local_840;
  ReadWriteType local_83c;
  ResourceType local_838;
  ShaderType local_834;
  ContextResetType local_830;
  RobustAccessType local_82c;
  ReadWriteType local_828;
  ResourceType local_824;
  ShaderType local_820;
  ContextResetType local_81c;
  RobustAccessType local_818;
  ReadWriteType local_814;
  ResourceType local_810;
  ShaderType local_80c;
  ContextResetType local_808;
  RobustAccessType local_804;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  TestCaseGroup *local_760;
  TestCaseGroup *local_758;
  TestCaseGroup *local_750;
  TestCaseGroup *local_748;
  TestCaseGroup *local_740;
  string recoverScenarioDescription;
  string sharedScenarioDescription;
  string queryScenarioDescription;
  string syncScenarioDescription;
  long *local_6b8;
  long local_6b0;
  long local_6a8 [2];
  long *local_698;
  long local_690;
  long local_688 [2];
  RobustAccessType local_678;
  ContextResetType CStack_674;
  ShaderType SStack_670;
  ResourceType RStack_66c;
  size_type local_668;
  long *local_660;
  long local_658;
  long local_650 [2];
  long *local_640;
  long local_638;
  long local_630 [2];
  RobustAccessType local_620;
  ContextResetType CStack_61c;
  ShaderType SStack_618;
  ResourceType RStack_614;
  size_type local_610;
  long *local_608;
  long local_600;
  long local_5f8 [2];
  long *local_5e8;
  long local_5e0;
  long local_5d8 [2];
  RobustAccessType local_5c8;
  ContextResetType CStack_5c4;
  ShaderType SStack_5c0;
  ResourceType RStack_5bc;
  size_type local_5b8;
  long *local_5b0;
  long local_5a8;
  long local_5a0 [2];
  long *local_590;
  long local_588;
  long local_580 [2];
  RobustAccessType local_570;
  ContextResetType CStack_56c;
  ShaderType SStack_568;
  ResourceType RStack_564;
  size_type local_560;
  undefined1 local_558 [32];
  _Alloc_hider local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528 [2];
  undefined8 local_508;
  undefined1 local_500 [32];
  _Alloc_hider local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0 [2];
  undefined8 local_4b0;
  undefined1 local_4a8 [32];
  _Alloc_hider local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478 [2];
  undefined8 local_458;
  undefined1 local_450 [32];
  _Alloc_hider local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420 [2];
  undefined8 local_400;
  undefined1 local_3f8 [32];
  _Alloc_hider local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8 [2];
  undefined8 local_3a8;
  undefined1 local_3a0 [32];
  _Alloc_hider local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370 [2];
  undefined8 local_350;
  undefined1 local_348 [32];
  _Alloc_hider local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [2];
  undefined8 local_2f8;
  undefined1 local_2f0 [32];
  _Alloc_hider local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0 [2];
  undefined8 local_2a0;
  undefined1 local_298 [32];
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [2];
  undefined8 local_248;
  undefined1 local_240 [32];
  _Alloc_hider local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [2];
  undefined8 local_1f0;
  undefined1 local_1e8 [32];
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [2];
  undefined8 local_198;
  undefined1 local_190 [32];
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160 [2];
  undefined8 local_140;
  undefined1 local_138 [32];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  pointer local_f8;
  size_type sStack_f0;
  size_type local_e8;
  undefined1 local_e0 [32];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [2];
  undefined8 local_90;
  undefined1 local_88 [32];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  undefined8 local_38;
  
  local_ec0 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_ec0,eglTestCtx,"robustness","KHR_robustness tests");
  local_ea0 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_ea0,eglTestCtx,"create_context","Test valid context_creation attributes");
  local_eb0 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_eb0,eglTestCtx,"reset_context","Test context resets scenarios")
  ;
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this,eglTestCtx,"negative_context","Test invalid context creation attributes");
  local_ea8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_ea8,eglTestCtx,"shaders","Shader specific context reset tests")
  ;
  pTVar11 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar11,eglTestCtx,"fixed_function_pipeline",
             "Fixed function pipeline context reset tests with robust context");
  local_a10 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_a10,eglTestCtx,"fixed_function_pipeline_non_robust",
             "Fixed function pipeline context reset tests with non-robust context");
  pTVar12 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar12,eglTestCtx,"infinite_loop","Infinite loop scenarios");
  local_a00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_a00,eglTestCtx,"out_of_bounds",
             "Out of bounds access scenarios with robust context");
  local_a08 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_a08,eglTestCtx,"out_of_bounds_non_robust",
             "Out of bounds access scenarios with non-robust context");
  resetScenarioDescription._M_dataplus._M_p = (pointer)&resetScenarioDescription.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&resetScenarioDescription,"query error states and reset notifications","");
  syncScenarioDescription._M_dataplus._M_p = (pointer)&syncScenarioDescription.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&syncScenarioDescription,"query sync status with getSynciv()","");
  queryScenarioDescription._M_dataplus._M_p = (pointer)&queryScenarioDescription.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&queryScenarioDescription,
             "check availability of query result with getQueryObjectiv()","");
  sharedScenarioDescription._M_dataplus._M_p = (pointer)&sharedScenarioDescription.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sharedScenarioDescription,
             "check reset notification is propagated to shared context","");
  recoverScenarioDescription._M_dataplus._M_p = (pointer)&recoverScenarioDescription.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&recoverScenarioDescription,"delete the old context and create a new one","")
  ;
  local_f68 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f68,eglTestCtx,"reset_status",
             "Tests that query the reset status after a context reset has occurred");
  local_f70 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f70,eglTestCtx,"sync_status",
             "Tests that query the sync status after a context reset has occurred");
  local_f78 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f78,eglTestCtx,"query_status",
             "Tests that query the state of a query object after a context reset has occurred");
  local_eb8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_eb8,eglTestCtx,"shared_context_status",
             "Tests that query the state of a shared context after a reset has occurred");
  local_fa8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_fa8,eglTestCtx,"recover_from_reset",
             "Tests that attempt to create a new context after a context has occurred");
  local_9e8 = pTVar12;
  local_740 = pTVar11;
  if (createRobustnessTests(deqp::egl::EglTestContext&)::s_infiniteLoopCases == '\0') {
    iVar10 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                  s_infiniteLoopCases);
    if (iVar10 != 0) {
      local_1020._0_8_ = local_1020 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1020,"vertex","");
      local_fc8._M_dataplus._M_p = (pointer)&local_fc8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_fc8,"Provoke a context reset in vertex shader and ","");
      local_d90._M_dataplus._M_p = (pointer)((ulong)local_d90._M_dataplus._M_p._4_4_ << 0x20);
      local_db0._M_dataplus._M_p = (pointer)((ulong)local_db0._M_dataplus._M_p._4_4_ << 0x20);
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases,(string *)local_1020,&local_fc8,
                 (ContextResetType *)&local_d90,(ShaderType *)&local_db0);
      local_f98._M_dataplus._M_p = (pointer)&local_f98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f98,"fragment","");
      local_ee0._M_dataplus._M_p = (pointer)&local_ee0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ee0,"Provoke a context reset in fragment shader and ","");
      local_dd0._M_dataplus._M_p = (pointer)((ulong)local_dd0._M_dataplus._M_p._4_4_ << 0x20);
      local_df0._M_dataplus._M_p._0_4_ = 1;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases + 1,&local_f98,&local_ee0,
                 (ContextResetType *)&local_dd0,(ShaderType *)&local_df0);
      local_f00._M_dataplus._M_p = (pointer)&local_f00.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f00,"vertex_and_fragment","")
      ;
      local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f20,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_e10._M_dataplus._M_p = (pointer)((ulong)local_e10._M_dataplus._M_p._4_4_ << 0x20);
      local_e30._M_dataplus._M_p._0_4_ = 3;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases + 2,&local_f00,&local_f20,
                 (ContextResetType *)&local_e10,(ShaderType *)&local_e30);
      local_f40._M_dataplus._M_p = (pointer)&local_f40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f40,"compute","");
      local_f60._M_dataplus._M_p = (pointer)&local_f60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f60,"Provoke a context reset in compute shader and ","");
      local_e50._M_dataplus._M_p = (pointer)((ulong)local_e50._M_dataplus._M_p._4_4_ << 0x20);
      local_e70._M_dataplus._M_p._0_4_ = 2;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_infiniteLoopCases + 3,&local_f40,&local_f60,
                 (ContextResetType *)&local_e50,(ShaderType *)&local_e70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f60._M_dataplus._M_p != &local_f60.field_2) {
        operator_delete(local_f60._M_dataplus._M_p,local_f60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f40._M_dataplus._M_p != &local_f40.field_2) {
        operator_delete(local_f40._M_dataplus._M_p,local_f40.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
        operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f00._M_dataplus._M_p != &local_f00.field_2) {
        operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ee0._M_dataplus._M_p != &local_ee0.field_2) {
        operator_delete(local_ee0._M_dataplus._M_p,local_ee0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f98._M_dataplus._M_p != &local_f98.field_2) {
        operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
        operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::s_infiniteLoopCases);
    }
  }
  __lhs = &createRobustnessTests::s_infiniteLoopCases[0].m_description;
  lVar20 = 4;
  do {
    pTVar13 = (TestNode *)operator_new(0xf8);
    pcVar3 = __lhs[-1]._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1020,
                   __lhs,&resetScenarioDescription);
    uVar8 = local_1020._0_8_;
    local_138._0_8_ = local_138 + 0x10;
    pcVar4 = __lhs[-1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_138,pcVar4,pcVar4 + __lhs[-1]._M_string_length);
    local_118._M_p = (pointer)&local_108;
    pcVar4 = (__lhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar4,pcVar4 + __lhs->_M_string_length);
    local_e8 = __lhs[1].field_2._M_allocated_capacity;
    local_f8 = __lhs[1]._M_dataplus._M_p;
    sStack_f0 = __lhs[1]._M_string_length;
    anon_unknown_1::BasicResetCase::BasicResetCase
              ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_138);
    tcu::TestNode::addChild((TestNode *)local_f68,pTVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_p != &local_108) {
      operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
      operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
    }
    pTVar13 = (TestNode *)operator_new(0xf8);
    pcVar3 = __lhs[-1]._M_dataplus._M_p;
    std::operator+(&local_fc8,__lhs,&syncScenarioDescription);
    _Var9._M_p = local_fc8._M_dataplus._M_p;
    local_5b0 = local_5a0;
    pcVar4 = __lhs[-1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5b0,pcVar4,pcVar4 + __lhs[-1]._M_string_length);
    local_590 = local_580;
    pcVar4 = (__lhs->_M_dataplus)._M_p;
    local_fa0 = (TestCaseGroup *)lVar20;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_590,pcVar4,pcVar4 + __lhs->_M_string_length);
    pbVar1 = __lhs + 1;
    local_560 = __lhs[1].field_2._M_allocated_capacity;
    local_570 = *(RobustAccessType *)&(pbVar1->_M_dataplus)._M_p;
    CStack_56c = *(ContextResetType *)((long)&__lhs[1]._M_dataplus._M_p + 4);
    SStack_568 = (ShaderType)__lhs[1]._M_string_length;
    RStack_564 = *(ResourceType *)((long)&__lhs[1]._M_string_length + 4);
    local_1020._0_8_ = local_1020 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1020,local_5b0,local_5a8 + (long)local_5b0);
    local_1000._M_p = (pointer)local_ff0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1000,local_590,local_588 + (long)local_590);
    local_fd0 = local_560;
    local_ff0[1]._4_4_ = CStack_56c;
    local_ff0[1]._0_4_ = local_570;
    local_ff0[1]._12_4_ = RStack_564;
    local_ff0[1]._8_4_ = SStack_568;
    anon_unknown_1::ContextResetCase::ContextResetCase
              ((ContextResetCase *)pTVar13,eglTestCtx,pcVar3,_Var9._M_p,(Params *)local_1020);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1000._M_p != local_ff0) {
      operator_delete(local_1000._M_p,local_ff0[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
      operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
    }
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__RobustnessTestCase_02161eb8;
    tcu::TestNode::addChild((TestNode *)local_f70,pTVar13);
    if (local_590 != local_580) {
      operator_delete(local_590,local_580[0] + 1);
    }
    if (local_5b0 != local_5a0) {
      operator_delete(local_5b0,local_5a0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
      operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
    }
    pTVar13 = (TestNode *)operator_new(0xf8);
    pcVar3 = __lhs[-1]._M_dataplus._M_p;
    std::operator+(&local_fc8,__lhs,&queryScenarioDescription);
    _Var9._M_p = local_fc8._M_dataplus._M_p;
    local_608 = local_5f8;
    pcVar4 = __lhs[-1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_608,pcVar4,pcVar4 + __lhs[-1]._M_string_length);
    local_5e8 = local_5d8;
    pcVar4 = (__lhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5e8,pcVar4,pcVar4 + __lhs->_M_string_length);
    local_5b8 = __lhs[1].field_2._M_allocated_capacity;
    local_5c8 = *(RobustAccessType *)&(pbVar1->_M_dataplus)._M_p;
    CStack_5c4 = *(ContextResetType *)((long)&__lhs[1]._M_dataplus._M_p + 4);
    SStack_5c0 = (ShaderType)__lhs[1]._M_string_length;
    RStack_5bc = *(ResourceType *)((long)&__lhs[1]._M_string_length + 4);
    local_1020._0_8_ = local_1020 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1020,local_608,local_600 + (long)local_608);
    local_1000._M_p = (pointer)local_ff0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1000,local_5e8,local_5e0 + (long)local_5e8);
    local_fd0 = local_5b8;
    local_ff0[1]._4_4_ = CStack_5c4;
    local_ff0[1]._0_4_ = local_5c8;
    local_ff0[1]._12_4_ = RStack_5bc;
    local_ff0[1]._8_4_ = SStack_5c0;
    anon_unknown_1::ContextResetCase::ContextResetCase
              ((ContextResetCase *)pTVar13,eglTestCtx,pcVar3,_Var9._M_p,(Params *)local_1020);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1000._M_p != local_ff0) {
      operator_delete(local_1000._M_p,local_ff0[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
      operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
    }
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__RobustnessTestCase_02161f20;
    tcu::TestNode::addChild((TestNode *)local_f78,pTVar13);
    if (local_5e8 != local_5d8) {
      operator_delete(local_5e8,local_5d8[0] + 1);
    }
    if (local_608 != local_5f8) {
      operator_delete(local_608,local_5f8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
      operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
    }
    pRVar14 = (RobustnessTestCase *)operator_new(0xf8);
    pcVar3 = __lhs[-1]._M_dataplus._M_p;
    std::operator+(&local_fc8,__lhs,&sharedScenarioDescription);
    _Var9._M_p = local_fc8._M_dataplus._M_p;
    local_660 = local_650;
    pcVar4 = __lhs[-1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_660,pcVar4,pcVar4 + __lhs[-1]._M_string_length);
    local_640 = local_630;
    pcVar4 = (__lhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_640,pcVar4,pcVar4 + __lhs->_M_string_length);
    local_610 = __lhs[1].field_2._M_allocated_capacity;
    local_620 = *(RobustAccessType *)&(pbVar1->_M_dataplus)._M_p;
    CStack_61c = *(ContextResetType *)((long)&__lhs[1]._M_dataplus._M_p + 4);
    SStack_618 = (ShaderType)__lhs[1]._M_string_length;
    RStack_614 = *(ResourceType *)((long)&__lhs[1]._M_string_length + 4);
    local_1020._0_8_ = local_1020 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1020,local_660,local_658 + (long)local_660);
    local_1000._M_p = (pointer)local_ff0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1000,local_640,local_638 + (long)local_640);
    local_fd0 = local_610;
    local_ff0[1]._4_4_ = CStack_61c;
    local_ff0[1]._0_4_ = local_620;
    local_ff0[1]._12_4_ = RStack_614;
    local_ff0[1]._8_4_ = SStack_618;
    anon_unknown_1::RobustnessTestCase::RobustnessTestCase
              (pRVar14,eglTestCtx,pcVar3,_Var9._M_p,(Params *)local_1020);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1000._M_p != local_ff0) {
      operator_delete(local_1000._M_p,local_ff0[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
      operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
    }
    (pRVar14->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__RobustnessTestCase_02161f88;
    tcu::TestNode::addChild((TestNode *)local_eb8,(TestNode *)pRVar14);
    pTVar11 = local_fa0;
    if (local_640 != local_630) {
      operator_delete(local_640,local_630[0] + 1);
    }
    if (local_660 != local_650) {
      operator_delete(local_660,local_650[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
      operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
    }
    pRVar14 = (RobustnessTestCase *)operator_new(0xf8);
    pcVar3 = __lhs[-1]._M_dataplus._M_p;
    std::operator+(&local_fc8,__lhs,&recoverScenarioDescription);
    _Var9._M_p = local_fc8._M_dataplus._M_p;
    local_6b8 = local_6a8;
    pcVar4 = __lhs[-1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6b8,pcVar4,pcVar4 + __lhs[-1]._M_string_length);
    local_698 = local_688;
    pcVar4 = (__lhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_698,pcVar4,pcVar4 + __lhs->_M_string_length);
    local_668 = __lhs[1].field_2._M_allocated_capacity;
    local_678 = *(RobustAccessType *)&(pbVar1->_M_dataplus)._M_p;
    CStack_674 = *(ContextResetType *)((long)&__lhs[1]._M_dataplus._M_p + 4);
    SStack_670 = (ShaderType)__lhs[1]._M_string_length;
    RStack_66c = *(ResourceType *)((long)&__lhs[1]._M_string_length + 4);
    local_1020._0_8_ = local_1020 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1020,local_6b8,local_6b0 + (long)local_6b8);
    local_1000._M_p = (pointer)local_ff0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1000,local_698,local_690 + (long)local_698);
    local_fd0 = local_668;
    local_ff0[1]._4_4_ = CStack_674;
    local_ff0[1]._0_4_ = local_678;
    local_ff0[1]._12_4_ = RStack_66c;
    local_ff0[1]._8_4_ = SStack_670;
    anon_unknown_1::RobustnessTestCase::RobustnessTestCase
              (pRVar14,eglTestCtx,pcVar3,_Var9._M_p,(Params *)local_1020);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1000._M_p != local_ff0) {
      operator_delete(local_1000._M_p,local_ff0[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
      operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
    }
    (pRVar14->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__RobustnessTestCase_02161fd8;
    tcu::TestNode::addChild((TestNode *)local_fa8,(TestNode *)pRVar14);
    if (local_698 != local_688) {
      operator_delete(local_698,local_688[0] + 1);
    }
    pTVar12 = local_9e8;
    if (local_6b8 != local_6a8) {
      operator_delete(local_6b8,local_6a8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
      operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
    }
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (__lhs[2].field_2._M_local_buf + 8);
    lVar20 = (long)pTVar11 + -1;
  } while (lVar20 != 0);
  tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_f68);
  tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_f70);
  tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_f78);
  tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_eb8);
  tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_fa8);
  pTVar11 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar11,eglTestCtx,"uniform_block","Uniform Block Accesses");
  pTVar12 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar12,eglTestCtx,"uniform_block","Uniform Block Accesses");
  pTVar15 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar15,eglTestCtx,"shader_storage_block","Shader Storage Block accesses");
  pTVar16 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar16,eglTestCtx,"shader_storage_block","Shader Storage Block accesses");
  pTVar17 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar17,eglTestCtx,"local_array","Local array accesses");
  local_9f0 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_9f0,eglTestCtx,"local_array","Local array accesses");
  local_f78 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_f78,eglTestCtx,"uniform_block","Uniform Block Accesses");
  local_9f8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_9f8,eglTestCtx,"uniform_block","Uniform Block Accesses");
  local_f68 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f68,eglTestCtx,"shader_storage_block","Shader Storage Block accesses");
  local_fa0 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_fa0,eglTestCtx,"shader_storage_block","Shader Storage Block accesses");
  local_f70 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_f70,eglTestCtx,"local_array","Local array accesses");
  local_fa8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(local_fa8,eglTestCtx,"local_array","Local array accesses");
  local_eb8 = pTVar16;
  local_760 = pTVar12;
  local_758 = pTVar11;
  local_750 = pTVar17;
  local_748 = pTVar15;
  if (createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundReadCases == '\0') {
    iVar10 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                  s_outOfBoundReadCases);
    if (iVar10 != 0) {
      local_1020._0_8_ = local_1020 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1020,"vertex","");
      local_fc8._M_dataplus._M_p = (pointer)&local_fc8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_fc8,"Provoke a context reset in vertex shader and ","");
      local_804 = ROBUSTACCESS_TRUE;
      local_808 = CONTEXTRESETTYPE_SHADER_OOB;
      local_80c = SHADERTYPE_VERT;
      local_810 = RESOURCETYPE_UBO;
      local_814 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases,(string *)local_1020,&local_fc8,
                 &local_804,&local_808,&local_80c,&local_810,&local_814);
      local_f98._M_dataplus._M_p = (pointer)&local_f98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f98,"fragment","");
      local_ee0._M_dataplus._M_p = (pointer)&local_ee0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ee0,"Provoke a context reset in fragment shader and ","");
      local_818 = ROBUSTACCESS_TRUE;
      local_81c = CONTEXTRESETTYPE_SHADER_OOB;
      local_820 = SHADERTYPE_FRAG;
      local_824 = RESOURCETYPE_UBO;
      local_828 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 1,&local_f98,&local_ee0,&local_818,
                 &local_81c,&local_820,&local_824,&local_828);
      local_f00._M_dataplus._M_p = (pointer)&local_f00.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f00,"vertex_and_fragment","")
      ;
      local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f20,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_82c = ROBUSTACCESS_TRUE;
      local_830 = CONTEXTRESETTYPE_SHADER_OOB;
      local_834 = SHADERTYPE_VERT_AND_FRAG;
      local_838 = RESOURCETYPE_UBO;
      local_83c = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 2,&local_f00,&local_f20,&local_82c,
                 &local_830,&local_834,&local_838,&local_83c);
      local_f40._M_dataplus._M_p = (pointer)&local_f40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f40,"compute","");
      local_f60._M_dataplus._M_p = (pointer)&local_f60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f60,"Provoke a context reset in compute shader and ","");
      local_840 = ROBUSTACCESS_TRUE;
      local_844 = CONTEXTRESETTYPE_SHADER_OOB;
      local_848 = SHADERTYPE_COMPUTE;
      local_84c = RESOURCETYPE_UBO;
      local_850 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 3,&local_f40,&local_f60,&local_840,
                 &local_844,&local_848,&local_84c,&local_850);
      local_d90._M_dataplus._M_p = (pointer)&local_d90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d90,"vertex","");
      local_db0._M_dataplus._M_p = (pointer)&local_db0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_db0,"Provoke a context reset in vertex shader and ","");
      local_854 = ROBUSTACCESS_TRUE;
      local_858 = CONTEXTRESETTYPE_SHADER_OOB;
      local_85c = SHADERTYPE_VERT;
      local_860 = RESOURCETYPE_SSBO;
      local_864 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 4,&local_d90,&local_db0,&local_854,
                 &local_858,&local_85c,&local_860,&local_864);
      local_dd0._M_dataplus._M_p = (pointer)&local_dd0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_dd0,"fragment","");
      local_df0._M_dataplus._M_p = (pointer)&local_df0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_df0,"Provoke a context reset in fragment shader and ","");
      local_868 = ROBUSTACCESS_TRUE;
      local_86c = CONTEXTRESETTYPE_SHADER_OOB;
      local_870 = SHADERTYPE_FRAG;
      local_874 = RESOURCETYPE_SSBO;
      local_878 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 5,&local_dd0,&local_df0,&local_868,
                 &local_86c,&local_870,&local_874,&local_878);
      local_e10._M_dataplus._M_p = (pointer)&local_e10.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e10,"vertex_and_fragment","")
      ;
      local_e30._M_dataplus._M_p = (pointer)&local_e30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e30,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_87c = ROBUSTACCESS_TRUE;
      local_880 = CONTEXTRESETTYPE_SHADER_OOB;
      local_884 = SHADERTYPE_VERT_AND_FRAG;
      local_888 = RESOURCETYPE_SSBO;
      local_88c = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 6,&local_e10,&local_e30,&local_87c,
                 &local_880,&local_884,&local_888,&local_88c);
      local_e50._M_dataplus._M_p = (pointer)&local_e50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e50,"compute","");
      local_e70._M_dataplus._M_p = (pointer)&local_e70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e70,"Provoke a context reset in compute shader and ","");
      local_890 = ROBUSTACCESS_TRUE;
      local_894 = CONTEXTRESETTYPE_SHADER_OOB;
      local_898 = SHADERTYPE_COMPUTE;
      local_89c = RESOURCETYPE_SSBO;
      local_8a0 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 7,&local_e50,&local_e70,&local_890,
                 &local_894,&local_898,&local_89c,&local_8a0);
      local_d10._M_dataplus._M_p = (pointer)&local_d10.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d10,"vertex","");
      local_d30._M_dataplus._M_p = (pointer)&local_d30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d30,"Provoke a context reset in vertex shader and ","");
      local_8a4 = ROBUSTACCESS_TRUE;
      local_8a8 = CONTEXTRESETTYPE_SHADER_OOB;
      local_8ac = SHADERTYPE_VERT;
      local_8b0 = RESOURCETYPE_LOCAL_ARRAY;
      local_8b4 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 8,&local_d10,&local_d30,&local_8a4,
                 &local_8a8,&local_8ac,&local_8b0,&local_8b4);
      local_d50._M_dataplus._M_p = (pointer)&local_d50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d50,"fragment","");
      local_d70._M_dataplus._M_p = (pointer)&local_d70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d70,"Provoke a context reset in fragment shader and ","");
      local_8b8 = ROBUSTACCESS_TRUE;
      local_8bc = CONTEXTRESETTYPE_SHADER_OOB;
      local_8c0 = SHADERTYPE_FRAG;
      local_8c4 = RESOURCETYPE_LOCAL_ARRAY;
      local_8c8 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 9,&local_d50,&local_d70,&local_8b8,
                 &local_8bc,&local_8c0,&local_8c4,&local_8c8);
      local_a30._M_dataplus._M_p = (pointer)&local_a30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a30,"vertex_and_fragment","")
      ;
      local_a50._M_dataplus._M_p = (pointer)&local_a50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a50,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_8cc = ROBUSTACCESS_TRUE;
      local_8d0 = CONTEXTRESETTYPE_SHADER_OOB;
      local_8d4 = SHADERTYPE_VERT_AND_FRAG;
      local_8d8 = RESOURCETYPE_LOCAL_ARRAY;
      local_8dc = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 10,&local_a30,&local_a50,&local_8cc,
                 &local_8d0,&local_8d4,&local_8d8,&local_8dc);
      local_a70._M_dataplus._M_p = (pointer)&local_a70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a70,"compute","");
      local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a90,"Provoke a context reset in compute shader and ","");
      local_8e0 = ROBUSTACCESS_TRUE;
      local_8e4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_8e8 = SHADERTYPE_COMPUTE;
      local_8ec = RESOURCETYPE_LOCAL_ARRAY;
      local_8f0 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xb,&local_a70,&local_a90,&local_8e0
                 ,&local_8e4,&local_8e8,&local_8ec,&local_8f0);
      local_ab0._M_dataplus._M_p = (pointer)&local_ab0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab0,"vertex","");
      local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ad0,"Provoke a context reset in vertex shader and ","");
      local_8f4 = ROBUSTACCESS_FALSE;
      local_8f8 = CONTEXTRESETTYPE_SHADER_OOB;
      local_8fc = SHADERTYPE_VERT;
      local_900 = RESOURCETYPE_UBO;
      local_904 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xc,&local_ab0,&local_ad0,&local_8f4
                 ,&local_8f8,&local_8fc,&local_900,&local_904);
      local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_af0,"fragment","");
      local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b10,"Provoke a context reset in fragment shader and ","");
      local_908 = ROBUSTACCESS_FALSE;
      local_90c = CONTEXTRESETTYPE_SHADER_OOB;
      local_910 = SHADERTYPE_FRAG;
      local_914 = RESOURCETYPE_UBO;
      local_918 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xd,&local_af0,&local_b10,&local_908
                 ,&local_90c,&local_910,&local_914,&local_918);
      local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b30,"vertex_and_fragment","")
      ;
      local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b50,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_91c = ROBUSTACCESS_FALSE;
      local_920 = CONTEXTRESETTYPE_SHADER_OOB;
      local_924 = SHADERTYPE_VERT_AND_FRAG;
      local_928 = RESOURCETYPE_UBO;
      local_92c = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xe,&local_b30,&local_b50,&local_91c
                 ,&local_920,&local_924,&local_928,&local_92c);
      local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b70,"compute","");
      local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b90,"Provoke a context reset in compute shader and ","");
      local_930 = ROBUSTACCESS_FALSE;
      local_934 = CONTEXTRESETTYPE_SHADER_OOB;
      local_938 = SHADERTYPE_COMPUTE;
      local_93c = RESOURCETYPE_UBO;
      local_940 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0xf,&local_b70,&local_b90,&local_930
                 ,&local_934,&local_938,&local_93c,&local_940);
      local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb0,"vertex","");
      local_bd0._M_dataplus._M_p = (pointer)&local_bd0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_bd0,"Provoke a context reset in vertex shader and ","");
      local_944 = ROBUSTACCESS_FALSE;
      local_948 = CONTEXTRESETTYPE_SHADER_OOB;
      local_94c = SHADERTYPE_VERT;
      local_950 = RESOURCETYPE_SSBO;
      local_954 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x10,&local_bb0,&local_bd0,
                 &local_944,&local_948,&local_94c,&local_950,&local_954);
      local_bf0._M_dataplus._M_p = (pointer)&local_bf0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bf0,"fragment","");
      local_c10._M_dataplus._M_p = (pointer)&local_c10.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c10,"Provoke a context reset in fragment shader and ","");
      local_958 = ROBUSTACCESS_FALSE;
      local_95c = CONTEXTRESETTYPE_SHADER_OOB;
      local_960 = SHADERTYPE_FRAG;
      local_964 = RESOURCETYPE_SSBO;
      local_968 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x11,&local_bf0,&local_c10,
                 &local_958,&local_95c,&local_960,&local_964,&local_968);
      local_c30._M_dataplus._M_p = (pointer)&local_c30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c30,"vertex_and_fragment","")
      ;
      local_c50._M_dataplus._M_p = (pointer)&local_c50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c50,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_96c = ROBUSTACCESS_FALSE;
      local_970 = CONTEXTRESETTYPE_SHADER_OOB;
      local_974 = SHADERTYPE_VERT_AND_FRAG;
      local_978 = RESOURCETYPE_SSBO;
      local_97c = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x12,&local_c30,&local_c50,
                 &local_96c,&local_970,&local_974,&local_978,&local_97c);
      local_c70._M_dataplus._M_p = (pointer)&local_c70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c70,"compute","");
      local_c90._M_dataplus._M_p = (pointer)&local_c90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c90,"Provoke a context reset in compute shader and ","");
      local_980 = ROBUSTACCESS_FALSE;
      local_984 = CONTEXTRESETTYPE_SHADER_OOB;
      local_988 = SHADERTYPE_COMPUTE;
      local_98c = RESOURCETYPE_SSBO;
      local_990 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x13,&local_c70,&local_c90,
                 &local_980,&local_984,&local_988,&local_98c,&local_990);
      local_cb0._M_dataplus._M_p = (pointer)&local_cb0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb0,"vertex","");
      local_cd0._M_dataplus._M_p = (pointer)&local_cd0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_cd0,"Provoke a context reset in vertex shader and ","");
      local_994 = ROBUSTACCESS_FALSE;
      local_998 = CONTEXTRESETTYPE_SHADER_OOB;
      local_99c = SHADERTYPE_VERT;
      local_9a0 = RESOURCETYPE_LOCAL_ARRAY;
      local_9a4 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x14,&local_cb0,&local_cd0,
                 &local_994,&local_998,&local_99c,&local_9a0,&local_9a4);
      local_cf0._M_dataplus._M_p = (pointer)&local_cf0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cf0,"fragment","");
      local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_780,"Provoke a context reset in fragment shader and ","");
      local_9a8 = ROBUSTACCESS_FALSE;
      local_9ac = CONTEXTRESETTYPE_SHADER_OOB;
      local_9b0 = SHADERTYPE_FRAG;
      local_9b4 = RESOURCETYPE_LOCAL_ARRAY;
      local_9b8 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x15,&local_cf0,&local_780,
                 &local_9a8,&local_9ac,&local_9b0,&local_9b4,&local_9b8);
      local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a0,"vertex_and_fragment","")
      ;
      local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_7c0,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_9bc = ROBUSTACCESS_FALSE;
      local_9c0 = CONTEXTRESETTYPE_SHADER_OOB;
      local_9c4 = SHADERTYPE_VERT_AND_FRAG;
      local_9c8 = RESOURCETYPE_LOCAL_ARRAY;
      local_9cc = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x16,&local_7a0,&local_7c0,
                 &local_9bc,&local_9c0,&local_9c4,&local_9c8,&local_9cc);
      local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e0,"compute","");
      local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_800,"Provoke a context reset in compute shader and ","");
      local_9d0 = ROBUSTACCESS_FALSE;
      local_9d4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_9d8 = SHADERTYPE_COMPUTE;
      local_9dc = RESOURCETYPE_LOCAL_ARRAY;
      local_9e0 = READWRITETYPE_READ;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundReadCases + 0x17,&local_7e0,&local_800,
                 &local_9d0,&local_9d4,&local_9d8,&local_9dc,&local_9e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_800._M_dataplus._M_p != &local_800.field_2) {
        operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
        operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
        operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
        operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_780._M_dataplus._M_p != &local_780.field_2) {
        operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cf0._M_dataplus._M_p != &local_cf0.field_2) {
        operator_delete(local_cf0._M_dataplus._M_p,local_cf0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cd0._M_dataplus._M_p != &local_cd0.field_2) {
        operator_delete(local_cd0._M_dataplus._M_p,local_cd0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cb0._M_dataplus._M_p != &local_cb0.field_2) {
        operator_delete(local_cb0._M_dataplus._M_p,local_cb0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c90._M_dataplus._M_p != &local_c90.field_2) {
        operator_delete(local_c90._M_dataplus._M_p,local_c90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
        operator_delete(local_c70._M_dataplus._M_p,local_c70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c50._M_dataplus._M_p != &local_c50.field_2) {
        operator_delete(local_c50._M_dataplus._M_p,local_c50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
        operator_delete(local_c30._M_dataplus._M_p,local_c30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c10._M_dataplus._M_p != &local_c10.field_2) {
        operator_delete(local_c10._M_dataplus._M_p,local_c10.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
        operator_delete(local_bf0._M_dataplus._M_p,local_bf0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd0._M_dataplus._M_p != &local_bd0.field_2) {
        operator_delete(local_bd0._M_dataplus._M_p,local_bd0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
        operator_delete(local_bb0._M_dataplus._M_p,local_bb0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
        operator_delete(local_b90._M_dataplus._M_p,local_b90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
        operator_delete(local_b70._M_dataplus._M_p,local_b70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
        operator_delete(local_b50._M_dataplus._M_p,local_b50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
        operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
        operator_delete(local_b10._M_dataplus._M_p,local_b10.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
        operator_delete(local_af0._M_dataplus._M_p,local_af0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
        operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ab0._M_dataplus._M_p != &local_ab0.field_2) {
        operator_delete(local_ab0._M_dataplus._M_p,local_ab0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
        operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
        operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a50._M_dataplus._M_p != &local_a50.field_2) {
        operator_delete(local_a50._M_dataplus._M_p,local_a50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
        operator_delete(local_a30._M_dataplus._M_p,local_a30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d70._M_dataplus._M_p != &local_d70.field_2) {
        operator_delete(local_d70._M_dataplus._M_p,local_d70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d50._M_dataplus._M_p != &local_d50.field_2) {
        operator_delete(local_d50._M_dataplus._M_p,local_d50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d30._M_dataplus._M_p != &local_d30.field_2) {
        operator_delete(local_d30._M_dataplus._M_p,local_d30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d10._M_dataplus._M_p != &local_d10.field_2) {
        operator_delete(local_d10._M_dataplus._M_p,local_d10.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e70._M_dataplus._M_p != &local_e70.field_2) {
        operator_delete(local_e70._M_dataplus._M_p,local_e70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e50._M_dataplus._M_p != &local_e50.field_2) {
        operator_delete(local_e50._M_dataplus._M_p,local_e50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e30._M_dataplus._M_p != &local_e30.field_2) {
        operator_delete(local_e30._M_dataplus._M_p,local_e30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e10._M_dataplus._M_p != &local_e10.field_2) {
        operator_delete(local_e10._M_dataplus._M_p,local_e10.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_df0._M_dataplus._M_p != &local_df0.field_2) {
        operator_delete(local_df0._M_dataplus._M_p,local_df0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_dd0._M_dataplus._M_p != &local_dd0.field_2) {
        operator_delete(local_dd0._M_dataplus._M_p,local_dd0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_db0._M_dataplus._M_p != &local_db0.field_2) {
        operator_delete(local_db0._M_dataplus._M_p,local_db0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d90._M_dataplus._M_p != &local_d90.field_2) {
        operator_delete(local_d90._M_dataplus._M_p,local_d90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f60._M_dataplus._M_p != &local_f60.field_2) {
        operator_delete(local_f60._M_dataplus._M_p,local_f60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f40._M_dataplus._M_p != &local_f40.field_2) {
        operator_delete(local_f40._M_dataplus._M_p,local_f40.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
        operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f00._M_dataplus._M_p != &local_f00.field_2) {
        operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ee0._M_dataplus._M_p != &local_ee0.field_2) {
        operator_delete(local_ee0._M_dataplus._M_p,local_ee0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f98._M_dataplus._M_p != &local_f98.field_2) {
        operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
        operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
      __cxa_atexit(__cxx_global_array_dtor_49,0,&__dso_handle);
      __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundReadCases)
      ;
    }
  }
  lVar20 = 0;
  do {
    if ((*(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_resourceType + lVar20) ==
         0) && (*(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType +
                        lVar20) == 0)) {
      pTVar13 = (TestNode *)operator_new(0xf8);
      pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name._M_dataplus.
                                 _M_p + lVar20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1020
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                              _M_dataplus._M_p + lVar20),&resetScenarioDescription);
      uVar8 = local_1020._0_8_;
      local_190._0_8_ = local_190 + 0x10;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name._M_dataplus.
                               _M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_190,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                  _M_string_length + lVar20) + lVar5);
      local_170._M_p = (pointer)local_160;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                               _M_dataplus._M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                  _M_string_length + lVar20) + lVar5);
      local_140 = *(undefined8 *)
                   ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_readWriteType + lVar20)
      ;
      local_160[1]._0_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType + lVar20);
      local_160[1]._8_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_shaderType + lVar20);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_190);
      tcu::TestNode::addChild((TestNode *)local_758,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_p != local_160) {
        operator_delete(local_170._M_p,local_160[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
        operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
    }
    if ((*(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_resourceType + lVar20) ==
         0) && (*(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType +
                        lVar20) == 1)) {
      pTVar13 = (TestNode *)operator_new(0xf8);
      pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name._M_dataplus.
                                 _M_p + lVar20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1020
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                              _M_dataplus._M_p + lVar20),&resetScenarioDescription);
      uVar8 = local_1020._0_8_;
      local_1e8._0_8_ = local_1e8 + 0x10;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name._M_dataplus.
                               _M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1e8,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                  _M_string_length + lVar20) + lVar5);
      local_1c8._M_p = (pointer)local_1b8;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                               _M_dataplus._M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                  _M_string_length + lVar20) + lVar5);
      local_198 = *(undefined8 *)
                   ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_readWriteType + lVar20)
      ;
      local_1b8[1]._0_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType + lVar20);
      local_1b8[1]._8_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_shaderType + lVar20);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_1e8);
      tcu::TestNode::addChild((TestNode *)local_f78,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_p != local_1b8) {
        operator_delete(local_1c8._M_p,local_1b8[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
    }
    if ((*(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_resourceType + lVar20) ==
         1) && (*(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType +
                        lVar20) == 0)) {
      pTVar13 = (TestNode *)operator_new(0xf8);
      pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name._M_dataplus.
                                 _M_p + lVar20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1020
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                              _M_dataplus._M_p + lVar20),&resetScenarioDescription);
      uVar8 = local_1020._0_8_;
      local_240._0_8_ = local_240 + 0x10;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name._M_dataplus.
                               _M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_240,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                  _M_string_length + lVar20) + lVar5);
      local_220._M_p = (pointer)local_210;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                               _M_dataplus._M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_220,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                  _M_string_length + lVar20) + lVar5);
      local_1f0 = *(undefined8 *)
                   ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_readWriteType + lVar20)
      ;
      local_210[1]._0_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType + lVar20);
      local_210[1]._8_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_shaderType + lVar20);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_240);
      tcu::TestNode::addChild((TestNode *)local_eb8,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_p != local_210) {
        operator_delete(local_220._M_p,local_210[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
        operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
    }
    if ((*(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_resourceType + lVar20) ==
         1) && (*(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType +
                        lVar20) == 1)) {
      pTVar13 = (TestNode *)operator_new(0xf8);
      pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name._M_dataplus.
                                 _M_p + lVar20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1020
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                              _M_dataplus._M_p + lVar20),&resetScenarioDescription);
      uVar8 = local_1020._0_8_;
      local_298._0_8_ = local_298 + 0x10;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name._M_dataplus.
                               _M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_298,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                  _M_string_length + lVar20) + lVar5);
      local_278._M_p = (pointer)local_268;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                               _M_dataplus._M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                  _M_string_length + lVar20) + lVar5);
      local_248 = *(undefined8 *)
                   ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_readWriteType + lVar20)
      ;
      local_268[1]._0_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType + lVar20);
      local_268[1]._8_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_shaderType + lVar20);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_298);
      tcu::TestNode::addChild((TestNode *)local_fa0,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_p != local_268) {
        operator_delete(local_278._M_p,local_268[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
    }
    if ((*(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_resourceType + lVar20) ==
         2) && (*(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType +
                        lVar20) == 0)) {
      pTVar13 = (TestNode *)operator_new(0xf8);
      pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name._M_dataplus.
                                 _M_p + lVar20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1020
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                              _M_dataplus._M_p + lVar20),&resetScenarioDescription);
      uVar8 = local_1020._0_8_;
      local_2f0._0_8_ = local_2f0 + 0x10;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name._M_dataplus.
                               _M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2f0,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                  _M_string_length + lVar20) + lVar5);
      local_2d0._M_p = (pointer)local_2c0;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                               _M_dataplus._M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d0,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                  _M_string_length + lVar20) + lVar5);
      local_2a0 = *(undefined8 *)
                   ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_readWriteType + lVar20)
      ;
      local_2c0[1]._0_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType + lVar20);
      local_2c0[1]._8_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_shaderType + lVar20);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_2f0);
      tcu::TestNode::addChild((TestNode *)local_9f0,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_p != local_2c0) {
        operator_delete(local_2d0._M_p,local_2c0[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
        operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
    }
    if ((*(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_resourceType + lVar20) ==
         2) && (*(int *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType +
                        lVar20) == 1)) {
      pTVar13 = (TestNode *)operator_new(0xf8);
      pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name._M_dataplus.
                                 _M_p + lVar20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1020
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                              _M_dataplus._M_p + lVar20),&resetScenarioDescription);
      uVar8 = local_1020._0_8_;
      local_348._0_8_ = local_348 + 0x10;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name._M_dataplus.
                               _M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_348,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_name.
                                  _M_string_length + lVar20) + lVar5);
      local_328._M_p = (pointer)local_318;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                               _M_dataplus._M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_328,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_description.
                                  _M_string_length + lVar20) + lVar5);
      local_2f8 = *(undefined8 *)
                   ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_readWriteType + lVar20)
      ;
      local_318[1]._0_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_robustAccessType + lVar20);
      local_318[1]._8_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundReadCases[0].m_shaderType + lVar20);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_348);
      tcu::TestNode::addChild((TestNode *)local_fa8,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_p != local_318) {
        operator_delete(local_328._M_p,local_318[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
        operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
    }
    lVar20 = lVar20 + 0x58;
  } while (lVar20 != 0x840);
  if (createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundWriteCases == '\0') {
    iVar10 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                  s_outOfBoundWriteCases);
    if (iVar10 != 0) {
      local_1020._0_8_ = local_1020 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1020,"vertex","");
      local_fc8._M_dataplus._M_p = (pointer)&local_fc8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_fc8,"Provoke a context reset in vertex shader and ","");
      local_804 = ROBUSTACCESS_TRUE;
      local_808 = CONTEXTRESETTYPE_SHADER_OOB;
      local_80c = SHADERTYPE_VERT;
      local_810 = RESOURCETYPE_UBO;
      local_814 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases,(string *)local_1020,&local_fc8,
                 &local_804,&local_808,&local_80c,&local_810,&local_814);
      local_f98._M_dataplus._M_p = (pointer)&local_f98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f98,"fragment","");
      local_ee0._M_dataplus._M_p = (pointer)&local_ee0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ee0,"Provoke a context reset in fragment shader and ","");
      local_818 = ROBUSTACCESS_TRUE;
      local_81c = CONTEXTRESETTYPE_SHADER_OOB;
      local_820 = SHADERTYPE_FRAG;
      local_824 = RESOURCETYPE_UBO;
      local_828 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 1,&local_f98,&local_ee0,&local_818,
                 &local_81c,&local_820,&local_824,&local_828);
      local_f00._M_dataplus._M_p = (pointer)&local_f00.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f00,"vertex_and_fragment","")
      ;
      local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f20,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_82c = ROBUSTACCESS_TRUE;
      local_830 = CONTEXTRESETTYPE_SHADER_OOB;
      local_834 = SHADERTYPE_VERT_AND_FRAG;
      local_838 = RESOURCETYPE_UBO;
      local_83c = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 2,&local_f00,&local_f20,&local_82c,
                 &local_830,&local_834,&local_838,&local_83c);
      local_f40._M_dataplus._M_p = (pointer)&local_f40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f40,"compute","");
      local_f60._M_dataplus._M_p = (pointer)&local_f60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f60,"Provoke a context reset in compute shader and ","");
      local_840 = ROBUSTACCESS_TRUE;
      local_844 = CONTEXTRESETTYPE_SHADER_OOB;
      local_848 = SHADERTYPE_COMPUTE;
      local_84c = RESOURCETYPE_UBO;
      local_850 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 3,&local_f40,&local_f60,&local_840,
                 &local_844,&local_848,&local_84c,&local_850);
      local_d90._M_dataplus._M_p = (pointer)&local_d90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d90,"vertex","");
      local_db0._M_dataplus._M_p = (pointer)&local_db0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_db0,"Provoke a context reset in vertex shader and ","");
      local_854 = ROBUSTACCESS_TRUE;
      local_858 = CONTEXTRESETTYPE_SHADER_OOB;
      local_85c = SHADERTYPE_VERT;
      local_860 = RESOURCETYPE_SSBO;
      local_864 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 4,&local_d90,&local_db0,&local_854,
                 &local_858,&local_85c,&local_860,&local_864);
      local_dd0._M_dataplus._M_p = (pointer)&local_dd0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_dd0,"fragment","");
      local_df0._M_dataplus._M_p = (pointer)&local_df0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_df0,"Provoke a context reset in fragment shader and ","");
      local_868 = ROBUSTACCESS_TRUE;
      local_86c = CONTEXTRESETTYPE_SHADER_OOB;
      local_870 = SHADERTYPE_FRAG;
      local_874 = RESOURCETYPE_SSBO;
      local_878 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 5,&local_dd0,&local_df0,&local_868,
                 &local_86c,&local_870,&local_874,&local_878);
      local_e10._M_dataplus._M_p = (pointer)&local_e10.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e10,"vertex_and_fragment","")
      ;
      local_e30._M_dataplus._M_p = (pointer)&local_e30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e30,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_87c = ROBUSTACCESS_TRUE;
      local_880 = CONTEXTRESETTYPE_SHADER_OOB;
      local_884 = SHADERTYPE_VERT_AND_FRAG;
      local_888 = RESOURCETYPE_SSBO;
      local_88c = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 6,&local_e10,&local_e30,&local_87c,
                 &local_880,&local_884,&local_888,&local_88c);
      local_e50._M_dataplus._M_p = (pointer)&local_e50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e50,"compute","");
      local_e70._M_dataplus._M_p = (pointer)&local_e70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e70,"Provoke a context reset in compute shader and ","");
      local_890 = ROBUSTACCESS_TRUE;
      local_894 = CONTEXTRESETTYPE_SHADER_OOB;
      local_898 = SHADERTYPE_COMPUTE;
      local_89c = RESOURCETYPE_SSBO;
      local_8a0 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 7,&local_e50,&local_e70,&local_890,
                 &local_894,&local_898,&local_89c,&local_8a0);
      local_d10._M_dataplus._M_p = (pointer)&local_d10.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d10,"vertex","");
      local_d30._M_dataplus._M_p = (pointer)&local_d30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d30,"Provoke a context reset in vertex shader and ","");
      local_8a4 = ROBUSTACCESS_TRUE;
      local_8a8 = CONTEXTRESETTYPE_SHADER_OOB;
      local_8ac = SHADERTYPE_VERT;
      local_8b0 = RESOURCETYPE_LOCAL_ARRAY;
      local_8b4 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 8,&local_d10,&local_d30,&local_8a4,
                 &local_8a8,&local_8ac,&local_8b0,&local_8b4);
      local_d50._M_dataplus._M_p = (pointer)&local_d50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d50,"fragment","");
      local_d70._M_dataplus._M_p = (pointer)&local_d70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d70,"Provoke a context reset in fragment shader and ","");
      local_8b8 = ROBUSTACCESS_TRUE;
      local_8bc = CONTEXTRESETTYPE_SHADER_OOB;
      local_8c0 = SHADERTYPE_FRAG;
      local_8c4 = RESOURCETYPE_LOCAL_ARRAY;
      local_8c8 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 9,&local_d50,&local_d70,&local_8b8,
                 &local_8bc,&local_8c0,&local_8c4,&local_8c8);
      local_a30._M_dataplus._M_p = (pointer)&local_a30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a30,"vertex_and_fragment","")
      ;
      local_a50._M_dataplus._M_p = (pointer)&local_a50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a50,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_8cc = ROBUSTACCESS_TRUE;
      local_8d0 = CONTEXTRESETTYPE_SHADER_OOB;
      local_8d4 = SHADERTYPE_VERT_AND_FRAG;
      local_8d8 = RESOURCETYPE_LOCAL_ARRAY;
      local_8dc = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 10,&local_a30,&local_a50,&local_8cc
                 ,&local_8d0,&local_8d4,&local_8d8,&local_8dc);
      local_a70._M_dataplus._M_p = (pointer)&local_a70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a70,"compute","");
      local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a90,"Provoke a context reset in compute shader and ","");
      local_8e0 = ROBUSTACCESS_TRUE;
      local_8e4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_8e8 = SHADERTYPE_COMPUTE;
      local_8ec = RESOURCETYPE_LOCAL_ARRAY;
      local_8f0 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xb,&local_a70,&local_a90,
                 &local_8e0,&local_8e4,&local_8e8,&local_8ec,&local_8f0);
      local_ab0._M_dataplus._M_p = (pointer)&local_ab0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab0,"vertex","");
      local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ad0,"Provoke a context reset in vertex shader and ","");
      local_8f4 = ROBUSTACCESS_FALSE;
      local_8f8 = CONTEXTRESETTYPE_SHADER_OOB;
      local_8fc = SHADERTYPE_VERT;
      local_900 = RESOURCETYPE_UBO;
      local_904 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xc,&local_ab0,&local_ad0,
                 &local_8f4,&local_8f8,&local_8fc,&local_900,&local_904);
      local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_af0,"fragment","");
      local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b10,"Provoke a context reset in fragment shader and ","");
      local_908 = ROBUSTACCESS_FALSE;
      local_90c = CONTEXTRESETTYPE_SHADER_OOB;
      local_910 = SHADERTYPE_FRAG;
      local_914 = RESOURCETYPE_UBO;
      local_918 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xd,&local_af0,&local_b10,
                 &local_908,&local_90c,&local_910,&local_914,&local_918);
      local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b30,"vertex_and_fragment","")
      ;
      local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b50,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_91c = ROBUSTACCESS_FALSE;
      local_920 = CONTEXTRESETTYPE_SHADER_OOB;
      local_924 = SHADERTYPE_VERT_AND_FRAG;
      local_928 = RESOURCETYPE_UBO;
      local_92c = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xe,&local_b30,&local_b50,
                 &local_91c,&local_920,&local_924,&local_928,&local_92c);
      local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b70,"compute","");
      local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b90,"Provoke a context reset in compute shader and ","");
      local_930 = ROBUSTACCESS_FALSE;
      local_934 = CONTEXTRESETTYPE_SHADER_OOB;
      local_938 = SHADERTYPE_COMPUTE;
      local_93c = RESOURCETYPE_UBO;
      local_940 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0xf,&local_b70,&local_b90,
                 &local_930,&local_934,&local_938,&local_93c,&local_940);
      local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb0,"vertex","");
      local_bd0._M_dataplus._M_p = (pointer)&local_bd0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_bd0,"Provoke a context reset in vertex shader and ","");
      local_944 = ROBUSTACCESS_FALSE;
      local_948 = CONTEXTRESETTYPE_SHADER_OOB;
      local_94c = SHADERTYPE_VERT;
      local_950 = RESOURCETYPE_SSBO;
      local_954 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x10,&local_bb0,&local_bd0,
                 &local_944,&local_948,&local_94c,&local_950,&local_954);
      local_bf0._M_dataplus._M_p = (pointer)&local_bf0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bf0,"fragment","");
      local_c10._M_dataplus._M_p = (pointer)&local_c10.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c10,"Provoke a context reset in fragment shader and ","");
      local_958 = ROBUSTACCESS_FALSE;
      local_95c = CONTEXTRESETTYPE_SHADER_OOB;
      local_960 = SHADERTYPE_FRAG;
      local_964 = RESOURCETYPE_SSBO;
      local_968 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x11,&local_bf0,&local_c10,
                 &local_958,&local_95c,&local_960,&local_964,&local_968);
      local_c30._M_dataplus._M_p = (pointer)&local_c30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c30,"vertex_and_fragment","")
      ;
      local_c50._M_dataplus._M_p = (pointer)&local_c50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c50,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_96c = ROBUSTACCESS_FALSE;
      local_970 = CONTEXTRESETTYPE_SHADER_OOB;
      local_974 = SHADERTYPE_VERT_AND_FRAG;
      local_978 = RESOURCETYPE_SSBO;
      local_97c = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x12,&local_c30,&local_c50,
                 &local_96c,&local_970,&local_974,&local_978,&local_97c);
      local_c70._M_dataplus._M_p = (pointer)&local_c70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c70,"compute","");
      local_c90._M_dataplus._M_p = (pointer)&local_c90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c90,"Provoke a context reset in compute shader and ","");
      local_980 = ROBUSTACCESS_FALSE;
      local_984 = CONTEXTRESETTYPE_SHADER_OOB;
      local_988 = SHADERTYPE_COMPUTE;
      local_98c = RESOURCETYPE_SSBO;
      local_990 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x13,&local_c70,&local_c90,
                 &local_980,&local_984,&local_988,&local_98c,&local_990);
      local_cb0._M_dataplus._M_p = (pointer)&local_cb0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb0,"vertex","");
      local_cd0._M_dataplus._M_p = (pointer)&local_cd0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_cd0,"Provoke a context reset in vertex shader and ","");
      local_994 = ROBUSTACCESS_FALSE;
      local_998 = CONTEXTRESETTYPE_SHADER_OOB;
      local_99c = SHADERTYPE_VERT;
      local_9a0 = RESOURCETYPE_LOCAL_ARRAY;
      local_9a4 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x14,&local_cb0,&local_cd0,
                 &local_994,&local_998,&local_99c,&local_9a0,&local_9a4);
      local_cf0._M_dataplus._M_p = (pointer)&local_cf0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cf0,"fragment","");
      local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_780,"Provoke a context reset in fragment shader and ","");
      local_9a8 = ROBUSTACCESS_FALSE;
      local_9ac = CONTEXTRESETTYPE_SHADER_OOB;
      local_9b0 = SHADERTYPE_FRAG;
      local_9b4 = RESOURCETYPE_LOCAL_ARRAY;
      local_9b8 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x15,&local_cf0,&local_780,
                 &local_9a8,&local_9ac,&local_9b0,&local_9b4,&local_9b8);
      local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a0,"vertex_and_fragment","")
      ;
      local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_7c0,"Provoke a context reset in vertex and fragment shader and ",
                 "");
      local_9bc = ROBUSTACCESS_FALSE;
      local_9c0 = CONTEXTRESETTYPE_SHADER_OOB;
      local_9c4 = SHADERTYPE_VERT_AND_FRAG;
      local_9c8 = RESOURCETYPE_LOCAL_ARRAY;
      local_9cc = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x16,&local_7a0,&local_7c0,
                 &local_9bc,&local_9c0,&local_9c4,&local_9c8,&local_9cc);
      local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e0,"compute","");
      local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_800,"Provoke a context reset in compute shader and ","");
      local_9d0 = ROBUSTACCESS_FALSE;
      local_9d4 = CONTEXTRESETTYPE_SHADER_OOB;
      local_9d8 = SHADERTYPE_COMPUTE;
      local_9dc = RESOURCETYPE_LOCAL_ARRAY;
      local_9e0 = READWRITETYPE_WRITE;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_outOfBoundWriteCases + 0x17,&local_7e0,&local_800,
                 &local_9d0,&local_9d4,&local_9d8,&local_9dc,&local_9e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_800._M_dataplus._M_p != &local_800.field_2) {
        operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
        operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
        operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
        operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_780._M_dataplus._M_p != &local_780.field_2) {
        operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cf0._M_dataplus._M_p != &local_cf0.field_2) {
        operator_delete(local_cf0._M_dataplus._M_p,local_cf0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cd0._M_dataplus._M_p != &local_cd0.field_2) {
        operator_delete(local_cd0._M_dataplus._M_p,local_cd0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cb0._M_dataplus._M_p != &local_cb0.field_2) {
        operator_delete(local_cb0._M_dataplus._M_p,local_cb0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c90._M_dataplus._M_p != &local_c90.field_2) {
        operator_delete(local_c90._M_dataplus._M_p,local_c90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
        operator_delete(local_c70._M_dataplus._M_p,local_c70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c50._M_dataplus._M_p != &local_c50.field_2) {
        operator_delete(local_c50._M_dataplus._M_p,local_c50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
        operator_delete(local_c30._M_dataplus._M_p,local_c30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c10._M_dataplus._M_p != &local_c10.field_2) {
        operator_delete(local_c10._M_dataplus._M_p,local_c10.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
        operator_delete(local_bf0._M_dataplus._M_p,local_bf0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd0._M_dataplus._M_p != &local_bd0.field_2) {
        operator_delete(local_bd0._M_dataplus._M_p,local_bd0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
        operator_delete(local_bb0._M_dataplus._M_p,local_bb0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
        operator_delete(local_b90._M_dataplus._M_p,local_b90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
        operator_delete(local_b70._M_dataplus._M_p,local_b70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
        operator_delete(local_b50._M_dataplus._M_p,local_b50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
        operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
        operator_delete(local_b10._M_dataplus._M_p,local_b10.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
        operator_delete(local_af0._M_dataplus._M_p,local_af0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
        operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ab0._M_dataplus._M_p != &local_ab0.field_2) {
        operator_delete(local_ab0._M_dataplus._M_p,local_ab0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
        operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
        operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a50._M_dataplus._M_p != &local_a50.field_2) {
        operator_delete(local_a50._M_dataplus._M_p,local_a50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
        operator_delete(local_a30._M_dataplus._M_p,local_a30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d70._M_dataplus._M_p != &local_d70.field_2) {
        operator_delete(local_d70._M_dataplus._M_p,local_d70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d50._M_dataplus._M_p != &local_d50.field_2) {
        operator_delete(local_d50._M_dataplus._M_p,local_d50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d30._M_dataplus._M_p != &local_d30.field_2) {
        operator_delete(local_d30._M_dataplus._M_p,local_d30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d10._M_dataplus._M_p != &local_d10.field_2) {
        operator_delete(local_d10._M_dataplus._M_p,local_d10.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e70._M_dataplus._M_p != &local_e70.field_2) {
        operator_delete(local_e70._M_dataplus._M_p,local_e70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e50._M_dataplus._M_p != &local_e50.field_2) {
        operator_delete(local_e50._M_dataplus._M_p,local_e50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e30._M_dataplus._M_p != &local_e30.field_2) {
        operator_delete(local_e30._M_dataplus._M_p,local_e30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e10._M_dataplus._M_p != &local_e10.field_2) {
        operator_delete(local_e10._M_dataplus._M_p,local_e10.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_df0._M_dataplus._M_p != &local_df0.field_2) {
        operator_delete(local_df0._M_dataplus._M_p,local_df0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_dd0._M_dataplus._M_p != &local_dd0.field_2) {
        operator_delete(local_dd0._M_dataplus._M_p,local_dd0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_db0._M_dataplus._M_p != &local_db0.field_2) {
        operator_delete(local_db0._M_dataplus._M_p,local_db0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d90._M_dataplus._M_p != &local_d90.field_2) {
        operator_delete(local_d90._M_dataplus._M_p,local_d90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f60._M_dataplus._M_p != &local_f60.field_2) {
        operator_delete(local_f60._M_dataplus._M_p,local_f60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f40._M_dataplus._M_p != &local_f40.field_2) {
        operator_delete(local_f40._M_dataplus._M_p,local_f40.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
        operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f00._M_dataplus._M_p != &local_f00.field_2) {
        operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ee0._M_dataplus._M_p != &local_ee0.field_2) {
        operator_delete(local_ee0._M_dataplus._M_p,local_ee0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f98._M_dataplus._M_p != &local_f98.field_2) {
        operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
        operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
      __cxa_atexit(__cxx_global_array_dtor_50,0,&__dso_handle);
      __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::s_outOfBoundWriteCases
                         );
    }
  }
  lVar20 = 0;
  do {
    if ((*(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_resourceType + lVar20)
         == 0) &&
       (*(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType + lVar20
                ) == 0)) {
      pTVar13 = (TestNode *)operator_new(0xf8);
      pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name._M_dataplus
                                 ._M_p + lVar20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1020
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                              _M_dataplus._M_p + lVar20),&resetScenarioDescription);
      uVar8 = local_1020._0_8_;
      local_3a0._0_8_ = local_3a0 + 0x10;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name._M_dataplus.
                               _M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3a0,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                  _M_string_length + lVar20) + lVar5);
      local_380._M_p = (pointer)local_370;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                               _M_dataplus._M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_380,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                  _M_string_length + lVar20) + lVar5);
      local_350 = *(undefined8 *)
                   ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_readWriteType + lVar20
                   );
      local_370[1]._0_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType + lVar20);
      local_370[1]._8_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_shaderType + lVar20);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_3a0);
      tcu::TestNode::addChild((TestNode *)local_760,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_p != local_370) {
        operator_delete(local_380._M_p,local_370[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
        operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
    }
    if ((*(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_resourceType + lVar20)
         == 0) &&
       (*(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType + lVar20
                ) == 1)) {
      pTVar13 = (TestNode *)operator_new(0xf8);
      pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name._M_dataplus
                                 ._M_p + lVar20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1020
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                              _M_dataplus._M_p + lVar20),&resetScenarioDescription);
      uVar8 = local_1020._0_8_;
      local_3f8._0_8_ = local_3f8 + 0x10;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name._M_dataplus.
                               _M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3f8,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                  _M_string_length + lVar20) + lVar5);
      local_3d8._M_p = (pointer)local_3c8;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                               _M_dataplus._M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3d8,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                  _M_string_length + lVar20) + lVar5);
      local_3a8 = *(undefined8 *)
                   ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_readWriteType + lVar20
                   );
      local_3c8[1]._0_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType + lVar20);
      local_3c8[1]._8_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_shaderType + lVar20);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_3f8);
      tcu::TestNode::addChild((TestNode *)local_9f8,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_p != local_3c8) {
        operator_delete(local_3d8._M_p,local_3c8[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
        operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
    }
    if ((*(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_resourceType + lVar20)
         == 1) &&
       (*(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType + lVar20
                ) == 0)) {
      pTVar13 = (TestNode *)operator_new(0xf8);
      pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name._M_dataplus
                                 ._M_p + lVar20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1020
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                              _M_dataplus._M_p + lVar20),&resetScenarioDescription);
      uVar8 = local_1020._0_8_;
      local_450._0_8_ = local_450 + 0x10;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name._M_dataplus.
                               _M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_450,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                  _M_string_length + lVar20) + lVar5);
      local_430._M_p = (pointer)local_420;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                               _M_dataplus._M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_430,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                  _M_string_length + lVar20) + lVar5);
      local_400 = *(undefined8 *)
                   ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_readWriteType + lVar20
                   );
      local_420[1]._0_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType + lVar20);
      local_420[1]._8_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_shaderType + lVar20);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_450);
      tcu::TestNode::addChild((TestNode *)local_748,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_p != local_420) {
        operator_delete(local_430._M_p,local_420[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
        operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
    }
    if ((*(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_resourceType + lVar20)
         == 1) &&
       (*(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType + lVar20
                ) == 1)) {
      pTVar13 = (TestNode *)operator_new(0xf8);
      pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name._M_dataplus
                                 ._M_p + lVar20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1020
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                              _M_dataplus._M_p + lVar20),&resetScenarioDescription);
      uVar8 = local_1020._0_8_;
      local_4a8._0_8_ = local_4a8 + 0x10;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name._M_dataplus.
                               _M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4a8,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                  _M_string_length + lVar20) + lVar5);
      local_488._M_p = (pointer)local_478;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                               _M_dataplus._M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_488,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                  _M_string_length + lVar20) + lVar5);
      local_458 = *(undefined8 *)
                   ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_readWriteType + lVar20
                   );
      local_478[1]._0_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType + lVar20);
      local_478[1]._8_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_shaderType + lVar20);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_4a8);
      tcu::TestNode::addChild((TestNode *)local_f68,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_p != local_478) {
        operator_delete(local_488._M_p,local_478[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
    }
    if ((*(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_resourceType + lVar20)
         == 2) &&
       (*(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType + lVar20
                ) == 0)) {
      pTVar13 = (TestNode *)operator_new(0xf8);
      pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name._M_dataplus
                                 ._M_p + lVar20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1020
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                              _M_dataplus._M_p + lVar20),&resetScenarioDescription);
      uVar8 = local_1020._0_8_;
      local_500._0_8_ = local_500 + 0x10;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name._M_dataplus.
                               _M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_500,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                  _M_string_length + lVar20) + lVar5);
      local_4e0._M_p = (pointer)local_4d0;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                               _M_dataplus._M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4e0,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                  _M_string_length + lVar20) + lVar5);
      local_4b0 = *(undefined8 *)
                   ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_readWriteType + lVar20
                   );
      local_4d0[1]._0_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType + lVar20);
      local_4d0[1]._8_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_shaderType + lVar20);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_500);
      tcu::TestNode::addChild((TestNode *)local_750,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_p != local_4d0) {
        operator_delete(local_4e0._M_p,local_4d0[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
        operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
    }
    if ((*(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_resourceType + lVar20)
         == 2) &&
       (*(int *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType + lVar20
                ) == 1)) {
      pTVar13 = (TestNode *)operator_new(0xf8);
      pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name._M_dataplus
                                 ._M_p + lVar20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1020
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                              _M_dataplus._M_p + lVar20),&resetScenarioDescription);
      uVar8 = local_1020._0_8_;
      local_558._0_8_ = local_558 + 0x10;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name._M_dataplus.
                               _M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_558,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_name.
                                  _M_string_length + lVar20) + lVar5);
      local_538._M_p = (pointer)local_528;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                               _M_dataplus._M_p + lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_538,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_description.
                                  _M_string_length + lVar20) + lVar5);
      local_508 = *(undefined8 *)
                   ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_readWriteType + lVar20
                   );
      local_528[1]._0_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_robustAccessType + lVar20);
      local_528[1]._8_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_outOfBoundWriteCases[0].m_shaderType + lVar20);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,(char *)uVar8,(Params *)local_558);
      tcu::TestNode::addChild((TestNode *)local_f70,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_p != local_528) {
        operator_delete(local_538._M_p,local_528[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_558._0_8_ != local_558 + 0x10) {
        operator_delete((void *)local_558._0_8_,local_558._16_8_ + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
    }
    lVar20 = lVar20 + 0x58;
  } while (lVar20 != 0x840);
  pTVar17 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar17,eglTestCtx,"reads","Out of bounds read accesses");
  pTVar16 = local_748;
  pTVar15 = local_750;
  pTVar12 = local_760;
  pTVar11 = local_eb8;
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(this_00,eglTestCtx,"writes","Out of bounds write accesses");
  tcu::TestNode::addChild((TestNode *)pTVar17,(TestNode *)local_758);
  tcu::TestNode::addChild((TestNode *)pTVar17,(TestNode *)pTVar11);
  tcu::TestNode::addChild((TestNode *)pTVar17,(TestNode *)local_9f0);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar12);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar16);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar15);
  pTVar11 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar11,eglTestCtx,"reset_status",
             "Tests that query the reset status after a context reset has occurred");
  tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)pTVar17);
  tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)local_a00,(TestNode *)pTVar11);
  pTVar11 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar11,eglTestCtx,"reads","Out of bounds read accesses");
  pTVar12 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar12,eglTestCtx,"writes","Out of bounds write accesses");
  tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_f78);
  tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_fa0);
  tcu::TestNode::addChild((TestNode *)pTVar11,(TestNode *)local_fa8);
  tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_9f8);
  tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_f68);
  tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_f70);
  pTVar15 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar15,eglTestCtx,"reset_status",
             "Tests that query the reset status after a context reset has occurred");
  tcu::TestNode::addChild((TestNode *)pTVar15,(TestNode *)pTVar11);
  tcu::TestNode::addChild((TestNode *)pTVar15,(TestNode *)pTVar12);
  tcu::TestNode::addChild((TestNode *)local_a08,(TestNode *)pTVar15);
  pTVar11 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar11,eglTestCtx,"reset_status",
             "Tests that query the reset status after a context reset has occurred");
  pTVar12 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar12,eglTestCtx,"reset_status",
             "Tests that query the reset status after a context reset has occurred");
  local_fa8 = pTVar11;
  local_fa0 = pTVar12;
  if (createRobustnessTests(deqp::egl::EglTestContext&)::s_fixedFunctionPipelineCases == '\0') {
    iVar10 = __cxa_guard_acquire(&createRobustnessTests(deqp::egl::EglTestContext&)::
                                  s_fixedFunctionPipelineCases);
    if (iVar10 != 0) {
      local_1020._0_8_ = local_1020 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1020,"index_buffer_out_of_bounds","");
      local_fc8._M_dataplus._M_p = (pointer)&local_fc8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_fc8,
                 "Provoke context reset and query error states and reset notifications","");
      local_d90._M_dataplus._M_p = local_d90._M_dataplus._M_p & 0xffffffff00000000;
      local_db0._M_dataplus._M_p._0_4_ = 2;
      local_dd0._M_dataplus._M_p = local_dd0._M_dataplus._M_p & 0xffffffff00000000;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_fixedFunctionPipelineCases,(string *)local_1020,&local_fc8
                 ,(RobustAccessType *)&local_d90,(ContextResetType *)&local_db0,
                 (FixedFunctionType *)&local_dd0);
      local_f98._M_dataplus._M_p = (pointer)&local_f98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f98,"vertex_buffer_out_of_bounds","");
      local_ee0._M_dataplus._M_p = (pointer)&local_ee0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ee0,
                 "Provoke context reset and query error states and reset notifications","");
      local_df0._M_dataplus._M_p = local_df0._M_dataplus._M_p & 0xffffffff00000000;
      local_e10._M_dataplus._M_p._0_4_ = 2;
      local_e30._M_dataplus._M_p._0_4_ = 1;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_fixedFunctionPipelineCases + 1,&local_f98,&local_ee0,
                 (RobustAccessType *)&local_df0,(ContextResetType *)&local_e10,
                 (FixedFunctionType *)&local_e30);
      local_f00._M_dataplus._M_p = (pointer)&local_f00.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f00,"index_buffer_out_of_bounds","");
      local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f20,
                 "Provoke context reset and query error states and reset notifications","");
      local_e50._M_dataplus._M_p._0_4_ = 1;
      local_e70._M_dataplus._M_p._0_4_ = 2;
      local_d10._M_dataplus._M_p = local_d10._M_dataplus._M_p & 0xffffffff00000000;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_fixedFunctionPipelineCases + 2,&local_f00,&local_f20,
                 (RobustAccessType *)&local_e50,(ContextResetType *)&local_e70,
                 (FixedFunctionType *)&local_d10);
      local_f40._M_dataplus._M_p = (pointer)&local_f40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f40,"vertex_buffer_out_of_bounds","");
      local_f60._M_dataplus._M_p = (pointer)&local_f60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f60,
                 "Provoke context reset and query error states and reset notifications","");
      local_d30._M_dataplus._M_p._0_4_ = 1;
      local_d50._M_dataplus._M_p._0_4_ = 2;
      local_d70._M_dataplus._M_p._0_4_ = 1;
      anon_unknown_1::RobustnessTestCase::Params::Params
                (createRobustnessTests::s_fixedFunctionPipelineCases + 3,&local_f40,&local_f60,
                 (RobustAccessType *)&local_d30,(ContextResetType *)&local_d50,
                 (FixedFunctionType *)&local_d70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f60._M_dataplus._M_p != &local_f60.field_2) {
        operator_delete(local_f60._M_dataplus._M_p,local_f60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f40._M_dataplus._M_p != &local_f40.field_2) {
        operator_delete(local_f40._M_dataplus._M_p,local_f40.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
        operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f00._M_dataplus._M_p != &local_f00.field_2) {
        operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ee0._M_dataplus._M_p != &local_ee0.field_2) {
        operator_delete(local_ee0._M_dataplus._M_p,local_ee0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f98._M_dataplus._M_p != &local_f98.field_2) {
        operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
        operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
      __cxa_atexit(__cxx_global_array_dtor_58,0,&__dso_handle);
      __cxa_guard_release(&createRobustnessTests(deqp::egl::EglTestContext&)::
                           s_fixedFunctionPipelineCases);
    }
  }
  lVar20 = 0x40;
  do {
    puVar2 = (undefined8 *)
             ((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].m_name._M_dataplus._M_p
             + lVar20);
    if (*(int *)((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].m_name._M_dataplus.
                        _M_p + lVar20) == 0) {
      pTVar13 = (TestNode *)operator_new(0xf8);
      pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].m_description.
                                 _M_string_length + lVar20);
      pcVar6 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].m_shaderType +
                         lVar20);
      local_88._0_8_ = local_88 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,pcVar3,
                 pcVar3 + *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].
                                           m_description.field_2 + lVar20));
      local_68._M_p = (pointer)local_58;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].m_shaderType +
                       lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].
                                  m_readWriteType + lVar20) + lVar5);
      local_38 = *(undefined8 *)
                  ((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].m_name.field_2 +
                  lVar20);
      local_58[1]._0_8_ = *puVar2;
      local_58[1]._8_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].m_name._M_string_length +
            lVar20);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,pcVar6,(Params *)local_88);
      tcu::TestNode::addChild((TestNode *)local_fa8,pTVar13);
      pTVar12 = local_740;
      pTVar11 = local_9e8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_p != local_58) {
        operator_delete(local_68._M_p,local_58[0]._M_allocated_capacity + 1);
      }
      puVar7 = local_88;
      plVar19 = (long *)local_88._0_8_;
    }
    else {
      pTVar13 = (TestNode *)operator_new(0xf8);
      pcVar3 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].m_description.
                                 _M_string_length + lVar20);
      pcVar6 = *(char **)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].m_shaderType +
                         lVar20);
      local_e0._0_8_ = local_e0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e0,pcVar3,
                 pcVar3 + *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].
                                           m_description.field_2 + lVar20));
      local_c0._M_p = (pointer)local_b0;
      lVar5 = *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].m_shaderType +
                       lVar20);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,lVar5,
                 *(long *)((long)&createRobustnessTests::s_outOfBoundWriteCases[0x17].
                                  m_readWriteType + lVar20) + lVar5);
      local_90 = *(undefined8 *)
                  ((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].m_name.field_2 +
                  lVar20);
      local_b0[1]._0_8_ = *puVar2;
      local_b0[1]._8_8_ =
           *(undefined8 *)
            ((long)&createRobustnessTests::s_fixedFunctionPipelineCases[0].m_name._M_string_length +
            lVar20);
      anon_unknown_1::BasicResetCase::BasicResetCase
                ((BasicResetCase *)pTVar13,eglTestCtx,pcVar3,pcVar6,(Params *)local_e0);
      tcu::TestNode::addChild((TestNode *)local_fa0,pTVar13);
      pTVar12 = local_740;
      pTVar11 = local_9e8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_p != local_b0) {
        operator_delete(local_c0._M_p,local_b0[0]._M_allocated_capacity + 1);
      }
      puVar7 = local_e0;
      plVar19 = (long *)local_e0._0_8_;
    }
    if (plVar19 != (long *)(puVar7 + 0x10)) {
      operator_delete(plVar19,*(long *)(puVar7 + 0x10) + 1);
    }
    lVar20 = lVar20 + 0x58;
  } while (lVar20 != 0x1a0);
  tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)local_fa8);
  tcu::TestNode::addChild((TestNode *)local_a10,(TestNode *)local_fa0);
  pTVar18 = (TestCase *)operator_new(0xf8);
  TestCase::TestCase(pTVar18,eglTestCtx,"query_robust_access",
                     "Query robust access after successfully creating a robust context");
  pTVar18[1].super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&pTVar18[1].super_TestCase.super_TestNode.m_name;
  pTVar18[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  *(undefined1 *)&pTVar18[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0;
  pTVar18[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity =
       (size_type)&pTVar18[1].super_TestCase.super_TestNode.m_description;
  *(undefined8 *)((long)&pTVar18[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  *(undefined1 *)&pTVar18[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = 0;
  pTVar18[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pTVar18[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar18[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar18[1].m_eglTestCtx = (EglTestContext *)0x0;
  *(undefined4 *)&pTVar18[2].super_TestCase.super_TestNode._vptr_TestNode = 0x300;
  (pTVar18->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RobustnessTestCase_02162028;
  tcu::TestNode::addChild((TestNode *)local_ea0,(TestNode *)pTVar18);
  pTVar18 = (TestCase *)operator_new(0xf8);
  TestCase::TestCase(pTVar18,eglTestCtx,"no_reset_notification",
                     "Query reset notification strategy after specifying GL_NO_RESET_NOTIFICATION");
  pTVar18[1].super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&pTVar18[1].super_TestCase.super_TestNode.m_name;
  pTVar18[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  *(undefined1 *)&pTVar18[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0;
  pTVar18[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity =
       (size_type)&pTVar18[1].super_TestCase.super_TestNode.m_description;
  *(undefined8 *)((long)&pTVar18[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  *(undefined1 *)&pTVar18[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = 0;
  pTVar18[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pTVar18[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar18[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar18[1].m_eglTestCtx = (EglTestContext *)0x0;
  *(undefined4 *)&pTVar18[2].super_TestCase.super_TestNode._vptr_TestNode = 0x300;
  (pTVar18->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RobustnessTestCase_02162078;
  tcu::TestNode::addChild((TestNode *)local_ea0,(TestNode *)pTVar18);
  pTVar18 = (TestCase *)operator_new(0xf8);
  TestCase::TestCase(pTVar18,eglTestCtx,"lose_context_on_reset",
                     "Query reset notification strategy after specifying GL_LOSE_CONTEXT_ON_RESET");
  pTVar18[1].super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&pTVar18[1].super_TestCase.super_TestNode.m_name;
  pTVar18[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  *(undefined1 *)&pTVar18[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0;
  pTVar18[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity =
       (size_type)&pTVar18[1].super_TestCase.super_TestNode.m_description;
  *(undefined8 *)((long)&pTVar18[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  *(undefined1 *)&pTVar18[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = 0;
  pTVar18[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pTVar18[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar18[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar18[1].m_eglTestCtx = (EglTestContext *)0x0;
  *(undefined4 *)&pTVar18[2].super_TestCase.super_TestNode._vptr_TestNode = 0x300;
  (pTVar18->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RobustnessTestCase_021620c8;
  tcu::TestNode::addChild((TestNode *)local_ea0,(TestNode *)pTVar18);
  pTVar18 = (TestCase *)operator_new(0xf8);
  TestCase::TestCase(pTVar18,eglTestCtx,"invalid_robust_context_creation",
                     "Create a non-robust context but specify a reset notification strategy");
  pTVar18[1].super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&pTVar18[1].super_TestCase.super_TestNode.m_name;
  pTVar18[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  *(undefined1 *)&pTVar18[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0;
  pTVar18[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity =
       (size_type)&pTVar18[1].super_TestCase.super_TestNode.m_description;
  *(undefined8 *)((long)&pTVar18[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  *(undefined1 *)&pTVar18[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = 0;
  pTVar18[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pTVar18[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar18[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar18[1].m_eglTestCtx = (EglTestContext *)0x0;
  *(undefined4 *)&pTVar18[2].super_TestCase.super_TestNode._vptr_TestNode = 0x300;
  (pTVar18->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RobustnessTestCase_02162118;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar18);
  pTVar18 = (TestCase *)operator_new(0xf8);
  TestCase::TestCase(pTVar18,eglTestCtx,"invalid_robust_shared_context_creation",
                     "Create a context share group with conflicting reset notification strategies");
  pTVar18[1].super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&pTVar18[1].super_TestCase.super_TestNode.m_name;
  pTVar18[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  *(undefined1 *)&pTVar18[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0;
  pTVar18[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity =
       (size_type)&pTVar18[1].super_TestCase.super_TestNode.m_description;
  *(undefined8 *)((long)&pTVar18[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  *(undefined1 *)&pTVar18[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = 0;
  pTVar18[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pTVar18[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar18[1].super_TestCase.super_TestNode.m_children.
  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar18[1].m_eglTestCtx = (EglTestContext *)0x0;
  *(undefined4 *)&pTVar18[2].super_TestCase.super_TestNode._vptr_TestNode = 0x300;
  (pTVar18->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RobustnessTestCase_02162168;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar18);
  tcu::TestNode::addChild((TestNode *)local_ea8,(TestNode *)pTVar11);
  tcu::TestNode::addChild((TestNode *)local_ea8,(TestNode *)local_a00);
  tcu::TestNode::addChild((TestNode *)local_ea8,(TestNode *)local_a08);
  tcu::TestNode::addChild((TestNode *)local_eb0,(TestNode *)local_ea8);
  tcu::TestNode::addChild((TestNode *)local_eb0,(TestNode *)pTVar12);
  tcu::TestNode::addChild((TestNode *)local_eb0,(TestNode *)local_a10);
  tcu::TestNode::addChild((TestNode *)local_ec0,(TestNode *)local_ea0);
  tcu::TestNode::addChild((TestNode *)local_ec0,(TestNode *)local_eb0);
  tcu::TestNode::addChild((TestNode *)local_ec0,(TestNode *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)recoverScenarioDescription._M_dataplus._M_p != &recoverScenarioDescription.field_2) {
    operator_delete(recoverScenarioDescription._M_dataplus._M_p,
                    recoverScenarioDescription.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sharedScenarioDescription._M_dataplus._M_p != &sharedScenarioDescription.field_2) {
    operator_delete(sharedScenarioDescription._M_dataplus._M_p,
                    sharedScenarioDescription.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)queryScenarioDescription._M_dataplus._M_p != &queryScenarioDescription.field_2) {
    operator_delete(queryScenarioDescription._M_dataplus._M_p,
                    queryScenarioDescription.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)syncScenarioDescription._M_dataplus._M_p != &syncScenarioDescription.field_2) {
    operator_delete(syncScenarioDescription._M_dataplus._M_p,
                    syncScenarioDescription.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resetScenarioDescription._M_dataplus._M_p != &resetScenarioDescription.field_2) {
    operator_delete(resetScenarioDescription._M_dataplus._M_p,
                    resetScenarioDescription.field_2._M_allocated_capacity + 1);
  }
  return local_ec0;
}

Assistant:

TestCaseGroup* createRobustnessTests (EglTestContext& eglTestCtx)
{
	de::MovePtr<TestCaseGroup> group (new TestCaseGroup(eglTestCtx, "robustness", "KHR_robustness tests"));

	tcu::TestCaseGroup* const contextCreationTestGroup			= new TestCaseGroup(eglTestCtx, "create_context",						"Test valid context_creation attributes");
	tcu::TestCaseGroup* const contextResetTestGroup				= new TestCaseGroup(eglTestCtx, "reset_context",						"Test context resets scenarios");
	tcu::TestCaseGroup* const negativeContextTestGroup			= new TestCaseGroup(eglTestCtx, "negative_context",						"Test invalid context creation attributes");

	tcu::TestCaseGroup* const shadersTestGroup					= new TestCaseGroup(eglTestCtx, "shaders",								"Shader specific context reset tests");
	tcu::TestCaseGroup* const fixedFunctionTestGroup			= new TestCaseGroup(eglTestCtx, "fixed_function_pipeline",				"Fixed function pipeline context reset tests with robust context");
	tcu::TestCaseGroup* const fixedFunctionNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "fixed_function_pipeline_non_robust",	"Fixed function pipeline context reset tests with non-robust context");

	tcu::TestCaseGroup* const infiniteLoopTestGroup				= new TestCaseGroup(eglTestCtx, "infinite_loop",						"Infinite loop scenarios");
	tcu::TestCaseGroup* const outOfBoundsTestGroup				= new TestCaseGroup(eglTestCtx, "out_of_bounds",						"Out of bounds access scenarios with robust context");

	tcu::TestCaseGroup* const outOfBoundsNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "out_of_bounds_non_robust",				"Out of bounds access scenarios with non-robust context");

	const string resetScenarioDescription	= "query error states and reset notifications";
	const string syncScenarioDescription	= "query sync status with getSynciv()";
	const string queryScenarioDescription	= "check availability of query result with getQueryObjectiv()";
	const string sharedScenarioDescription	= "check reset notification is propagated to shared context";
	const string recoverScenarioDescription	= "delete the old context and create a new one";

	// infinite loop test cases
	{
		tcu::TestCaseGroup* const infiniteLoopResetTestGroup	= new TestCaseGroup(eglTestCtx, "reset_status",				"Tests that query the reset status after a context reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopSyncTestGroup		= new TestCaseGroup(eglTestCtx, "sync_status",				"Tests that query the sync status after a context reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopQueryTestGroup	= new TestCaseGroup(eglTestCtx, "query_status",				"Tests that query the state of a query object after a context reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopSharedTestGroup	= new TestCaseGroup(eglTestCtx, "shared_context_status",	"Tests that query the state of a shared context after a reset has occurred");
		tcu::TestCaseGroup* const infiniteLoopRecoverTestGroup	= new TestCaseGroup(eglTestCtx, "recover_from_reset",		"Tests that attempt to create a new context after a context has occurred");

		static const RobustnessTestCase::Params s_infiniteLoopCases[] =
		{
			RobustnessTestCase::Params("vertex",				"Provoke a context reset in vertex shader and ",				CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_VERT),
			RobustnessTestCase::Params("fragment",				"Provoke a context reset in fragment shader and ",				CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_FRAG),
			RobustnessTestCase::Params("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_VERT_AND_FRAG),
			RobustnessTestCase::Params("compute",				"Provoke a context reset in compute shader and ",				CONTEXTRESETTYPE_INFINITE_LOOP,	SHADERTYPE_COMPUTE),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_infiniteLoopCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_infiniteLoopCases[testNdx];
			infiniteLoopResetTestGroup->addChild	(new BasicResetCase				(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));
			infiniteLoopSyncTestGroup->addChild		(new SyncObjectResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + syncScenarioDescription).c_str(), test));
			infiniteLoopQueryTestGroup->addChild	(new QueryObjectResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + queryScenarioDescription).c_str(), test));
			infiniteLoopSharedTestGroup->addChild	(new SharedContextResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + sharedScenarioDescription).c_str(), test));
			infiniteLoopRecoverTestGroup->addChild	(new RecoverFromResetCase		(eglTestCtx, test.getName().c_str(), (test.getDescription() + recoverScenarioDescription).c_str(), test));
		}

		infiniteLoopTestGroup->addChild(infiniteLoopResetTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopSyncTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopQueryTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopSharedTestGroup);
		infiniteLoopTestGroup->addChild(infiniteLoopRecoverTestGroup);
	}

	// out-of-bounds test cases
	{
		// robust context
		tcu::TestCaseGroup* const uboReadArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const uboWriteArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const ssboWriteArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const ssboReadArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const localWriteArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");
		tcu::TestCaseGroup* const localReadArrayResetTestGroup	= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");

		// non-robust context (internal use only)
		tcu::TestCaseGroup* const uboReadArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const uboWriteArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "uniform_block",		"Uniform Block Accesses");
		tcu::TestCaseGroup* const ssboWriteArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const ssboReadArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "shader_storage_block", "Shader Storage Block accesses");
		tcu::TestCaseGroup* const localWriteArrayResetNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");
		tcu::TestCaseGroup* const localReadArrayResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "local_array",			"Local array accesses");

		static const RobustnessTestCase::Params s_outOfBoundReadCases[] =
		{
			// ubo read only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_UBO, READWRITETYPE_READ),

			// ssbo read only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_SSBO, READWRITETYPE_READ),

			// local array read only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),

			// ubo read only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_UBO, READWRITETYPE_READ),

			// ssbo read only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_SSBO, READWRITETYPE_READ),

			// local array read only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_READ),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_outOfBoundReadCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_outOfBoundReadCases[testNdx];

			if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				uboReadArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
				uboReadArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				ssboReadArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
				ssboReadArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				localReadArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

			if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
				localReadArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));
		}

		static const RobustnessTestCase::Params s_outOfBoundWriteCases[] =
		{
			// ubo write only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),

			// ssbo write only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),

			// local array write only
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),

			// ubo write only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_UBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_UBO, READWRITETYPE_WRITE),

			// ssbo write only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_SSBO, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_SSBO, READWRITETYPE_WRITE),

			// local array write only (non-robust)
			RobustnessTestCase::Params ("vertex",				"Provoke a context reset in vertex shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("fragment",				"Provoke a context reset in fragment shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_FRAG,			RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("vertex_and_fragment",	"Provoke a context reset in vertex and fragment shader and ",	ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_VERT_AND_FRAG,	RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
			RobustnessTestCase::Params ("compute",				"Provoke a context reset in compute shader and ",				ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_SHADER_OOB, SHADERTYPE_COMPUTE,		RESOURCETYPE_LOCAL_ARRAY, READWRITETYPE_WRITE),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_outOfBoundWriteCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_outOfBoundWriteCases[testNdx];

				if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
					uboWriteArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_UBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
					uboWriteArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
					ssboWriteArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_SSBO && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
					ssboWriteArrayResetNonRobustTestGroup->addChild		(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_TRUE)
					localWriteArrayResetTestGroup->addChild				(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));

				if (test.getResourceType() == RESOURCETYPE_LOCAL_ARRAY && test.getRobustAccessType() == ROBUSTACCESS_FALSE)
					localWriteArrayResetNonRobustTestGroup->addChild	(new BasicResetCase(eglTestCtx, test.getName().c_str(), (test.getDescription() + resetScenarioDescription).c_str(), test));
		}

		// robust Context
		tcu::TestCaseGroup* const outOfBoundsResetReadAccessTestGroup	= new TestCaseGroup(eglTestCtx, "reads",	"Out of bounds read accesses");
		tcu::TestCaseGroup* const outOfBoundsResetWriteAccessTestGroup	= new TestCaseGroup(eglTestCtx, "writes",	"Out of bounds write accesses");

		outOfBoundsResetReadAccessTestGroup->addChild(uboReadArrayResetTestGroup);
		outOfBoundsResetReadAccessTestGroup->addChild(ssboReadArrayResetTestGroup);
		outOfBoundsResetReadAccessTestGroup->addChild(localReadArrayResetTestGroup);

		outOfBoundsResetWriteAccessTestGroup->addChild(uboWriteArrayResetTestGroup);
		outOfBoundsResetWriteAccessTestGroup->addChild(ssboWriteArrayResetTestGroup);
		outOfBoundsResetWriteAccessTestGroup->addChild(localWriteArrayResetTestGroup);

		tcu::TestCaseGroup* const outOfBoundsResetTestGroup		= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		outOfBoundsResetTestGroup->addChild(outOfBoundsResetReadAccessTestGroup);
		outOfBoundsResetTestGroup->addChild(outOfBoundsResetWriteAccessTestGroup);

		outOfBoundsTestGroup->addChild(outOfBoundsResetTestGroup);

		// non-robust Context (internal use only)
		tcu::TestCaseGroup* const outOfBoundsResetReadAccessNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "reads",	"Out of bounds read accesses");
		tcu::TestCaseGroup* const outOfBoundsResetWriteAccessNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "writes",	"Out of bounds write accesses");

		outOfBoundsResetReadAccessNonRobustTestGroup->addChild(uboReadArrayResetNonRobustTestGroup);
		outOfBoundsResetReadAccessNonRobustTestGroup->addChild(ssboReadArrayResetNonRobustTestGroup);
		outOfBoundsResetReadAccessNonRobustTestGroup->addChild(localReadArrayResetNonRobustTestGroup);

		outOfBoundsResetWriteAccessNonRobustTestGroup->addChild(uboWriteArrayResetNonRobustTestGroup);
		outOfBoundsResetWriteAccessNonRobustTestGroup->addChild(ssboWriteArrayResetNonRobustTestGroup);
		outOfBoundsResetWriteAccessNonRobustTestGroup->addChild(localWriteArrayResetNonRobustTestGroup);

		tcu::TestCaseGroup* const outOfBoundsResetNonRobustTestGroup		= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		outOfBoundsResetNonRobustTestGroup->addChild(outOfBoundsResetReadAccessNonRobustTestGroup);
		outOfBoundsResetNonRobustTestGroup->addChild(outOfBoundsResetWriteAccessNonRobustTestGroup);

		outOfBoundsNonRobustTestGroup->addChild(outOfBoundsResetNonRobustTestGroup);
	}

	// fixed function test cases
	{
		// robust context
		tcu::TestCaseGroup* const fixedFunctionResetStatusTestGroup				= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		// non-robust context (internal use only)
		tcu::TestCaseGroup* const fixedFunctionResetStatusNonRobustTestGroup	= new TestCaseGroup(eglTestCtx, "reset_status",	"Tests that query the reset status after a context reset has occurred");

		static const RobustnessTestCase::Params s_fixedFunctionPipelineCases[] =
		{
			RobustnessTestCase::Params( "index_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_INDICES),
			RobustnessTestCase::Params( "vertex_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_TRUE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_VERTICES),

			RobustnessTestCase::Params( "index_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_INDICES),
			RobustnessTestCase::Params( "vertex_buffer_out_of_bounds",	"Provoke context reset and query error states and reset notifications", ROBUSTACCESS_FALSE, CONTEXTRESETTYPE_FIXED_FUNC_OOB, FIXEDFUNCTIONTYPE_VERTICES),
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_fixedFunctionPipelineCases); ++testNdx)
		{
			const RobustnessTestCase::Params& test = s_fixedFunctionPipelineCases[testNdx];
			if (test.getRobustAccessType() == ROBUSTACCESS_TRUE)
				fixedFunctionResetStatusTestGroup->addChild(new BasicResetCase(eglTestCtx, test.getName().c_str(), test.getDescription().c_str(), test));
			else
				fixedFunctionResetStatusNonRobustTestGroup->addChild(new BasicResetCase(eglTestCtx, test.getName().c_str(), test.getDescription().c_str(), test));
		}

		fixedFunctionTestGroup->addChild(fixedFunctionResetStatusTestGroup);
		fixedFunctionNonRobustTestGroup->addChild(fixedFunctionResetStatusNonRobustTestGroup);
	}

	// context creation query cases
	{
		contextCreationTestGroup->addChild(new QueryRobustAccessCase	(eglTestCtx, "query_robust_access",		"Query robust access after successfully creating a robust context"));
		contextCreationTestGroup->addChild(new NoResetNotificationCase	(eglTestCtx, "no_reset_notification",	"Query reset notification strategy after specifying GL_NO_RESET_NOTIFICATION"));
		contextCreationTestGroup->addChild(new LoseContextOnResetCase	(eglTestCtx, "lose_context_on_reset",	"Query reset notification strategy after specifying GL_LOSE_CONTEXT_ON_RESET"));
	}

	// invalid context creation cases
	{
		negativeContextTestGroup->addChild(new InvalidContextCase		(eglTestCtx, "invalid_robust_context_creation",			"Create a non-robust context but specify a reset notification strategy"));
		negativeContextTestGroup->addChild(new InvalidShareContextCase	(eglTestCtx, "invalid_robust_shared_context_creation",	"Create a context share group with conflicting reset notification strategies"));
	}

	shadersTestGroup->addChild(infiniteLoopTestGroup);
	shadersTestGroup->addChild(outOfBoundsTestGroup);
	shadersTestGroup->addChild(outOfBoundsNonRobustTestGroup);

	contextResetTestGroup->addChild(shadersTestGroup);
	contextResetTestGroup->addChild(fixedFunctionTestGroup);
	contextResetTestGroup->addChild(fixedFunctionNonRobustTestGroup);

	group->addChild(contextCreationTestGroup);
	group->addChild(contextResetTestGroup);
	group->addChild(negativeContextTestGroup);

	return group.release();
}